

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx::CurveNiIntersector1<8>::
     occluded_n<embree::avx::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  byte bVar65;
  uint uVar66;
  ulong uVar67;
  bool bVar68;
  uint uVar69;
  long lVar70;
  ulong uVar71;
  ulong uVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar77 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar107 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  float t1;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar166;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar167;
  float fVar189;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar187;
  float fVar188;
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar193;
  float fVar210;
  float fVar211;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar206 [32];
  float fVar212;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar216;
  float fVar232;
  float fVar233;
  vfloat4 b0;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar235;
  float fVar237;
  float fVar238;
  undefined1 auVar228 [32];
  float fVar234;
  undefined1 auVar229 [32];
  undefined1 auVar236 [16];
  undefined1 auVar231 [64];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  float fVar264;
  float fVar265;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar266;
  float fVar267;
  undefined1 auVar263 [32];
  float fVar268;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar278;
  float fVar279;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  float fVar280;
  undefined1 auVar277 [32];
  vfloat4 a0;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar287 [16];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  vfloat4 a0_1;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [64];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar302;
  float fVar309;
  undefined1 auVar305 [16];
  float fVar307;
  float fVar308;
  float fVar310;
  float fVar311;
  float fVar312;
  float in_register_0000151c;
  undefined1 auVar306 [32];
  float fVar313;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  float fVar318;
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  float in_register_0000159c;
  undefined1 auVar323 [32];
  float fVar326;
  undefined1 auVar325 [16];
  float in_register_000015dc;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  int local_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  ulong local_420;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 auStack_3f8 [16];
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  ulong local_320;
  RTCFilterFunctionNArguments local_318;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 auStack_2a8 [16];
  uint auStack_298 [4];
  undefined8 local_288;
  undefined4 local_280;
  undefined8 local_27c;
  undefined4 local_274;
  undefined4 local_270;
  uint local_26c;
  uint local_268;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [32];
  float afStack_1b8 [8];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar230 [32];
  undefined1 auVar324 [32];
  
  PVar8 = prim[1];
  uVar72 = (ulong)(byte)PVar8;
  lVar70 = uVar72 * 5;
  fVar193 = *(float *)(prim + uVar72 * 0x19 + 0x12);
  auVar148 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar72 * 0x19 + 6));
  auVar194._0_4_ = fVar193 * (ray->dir).field_0.m128[0];
  auVar194._4_4_ = fVar193 * (ray->dir).field_0.m128[1];
  auVar194._8_4_ = fVar193 * (ray->dir).field_0.m128[2];
  auVar194._12_4_ = fVar193 * (ray->dir).field_0.m128[3];
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 4 + 6)));
  auVar256 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 4 + 10)));
  auVar102._0_4_ = fVar193 * auVar148._0_4_;
  auVar102._4_4_ = fVar193 * auVar148._4_4_;
  auVar102._8_4_ = fVar193 * auVar148._8_4_;
  auVar102._12_4_ = fVar193 * auVar148._12_4_;
  auVar92._16_16_ = auVar256;
  auVar92._0_16_ = auVar81;
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar70 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar256 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar70 + 10)));
  auVar150._16_16_ = auVar256;
  auVar150._0_16_ = auVar81;
  auVar14 = vcvtdq2ps_avx(auVar150);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 6 + 6)));
  auVar256 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 6 + 10)));
  auVar161._16_16_ = auVar256;
  auVar161._0_16_ = auVar81;
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xb + 6)));
  auVar256 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xb + 10)));
  auVar15 = vcvtdq2ps_avx(auVar161);
  auVar162._16_16_ = auVar256;
  auVar162._0_16_ = auVar81;
  auVar16 = vcvtdq2ps_avx(auVar162);
  uVar71 = (ulong)((uint)(byte)PVar8 * 0xc);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + 6)));
  auVar256 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + 10)));
  auVar228._16_16_ = auVar256;
  auVar228._0_16_ = auVar81;
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + uVar72 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar228);
  auVar256 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + uVar72 + 10)));
  auVar245._16_16_ = auVar256;
  auVar245._0_16_ = auVar81;
  lVar13 = uVar72 * 9;
  uVar71 = (ulong)(uint)((int)lVar13 * 2);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar245);
  auVar256 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + 10)));
  auVar246._16_16_ = auVar256;
  auVar246._0_16_ = auVar81;
  auVar19 = vcvtdq2ps_avx(auVar246);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + uVar72 + 6)));
  auVar256 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + uVar72 + 10)));
  auVar275._16_16_ = auVar256;
  auVar275._0_16_ = auVar81;
  uVar71 = (ulong)(uint)((int)lVar70 << 2);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + 6)));
  auVar256 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + 10)));
  auVar20 = vcvtdq2ps_avx(auVar275);
  auVar290._16_16_ = auVar256;
  auVar290._0_16_ = auVar81;
  auVar21 = vcvtdq2ps_avx(auVar290);
  auVar81 = vshufps_avx(auVar194,auVar194,0);
  auVar256 = vshufps_avx(auVar194,auVar194,0x55);
  auVar148 = vshufps_avx(auVar194,auVar194,0xaa);
  fVar193 = auVar148._0_4_;
  fVar216 = auVar148._4_4_;
  fVar210 = auVar148._8_4_;
  fVar232 = auVar148._12_4_;
  fVar211 = auVar256._0_4_;
  fVar233 = auVar256._4_4_;
  fVar212 = auVar256._8_4_;
  fVar234 = auVar256._12_4_;
  fVar213 = auVar81._0_4_;
  fVar235 = auVar81._4_4_;
  fVar214 = auVar81._8_4_;
  fVar237 = auVar81._12_4_;
  auVar306._0_4_ = fVar213 * auVar92._0_4_ + fVar211 * auVar14._0_4_ + fVar193 * auVar15._0_4_;
  auVar306._4_4_ = fVar235 * auVar92._4_4_ + fVar233 * auVar14._4_4_ + fVar216 * auVar15._4_4_;
  auVar306._8_4_ = fVar214 * auVar92._8_4_ + fVar212 * auVar14._8_4_ + fVar210 * auVar15._8_4_;
  auVar306._12_4_ = fVar237 * auVar92._12_4_ + fVar234 * auVar14._12_4_ + fVar232 * auVar15._12_4_;
  auVar306._16_4_ = fVar213 * auVar92._16_4_ + fVar211 * auVar14._16_4_ + fVar193 * auVar15._16_4_;
  auVar306._20_4_ = fVar235 * auVar92._20_4_ + fVar233 * auVar14._20_4_ + fVar216 * auVar15._20_4_;
  auVar306._24_4_ = fVar214 * auVar92._24_4_ + fVar212 * auVar14._24_4_ + fVar210 * auVar15._24_4_;
  auVar306._28_4_ = fVar234 + in_register_000015dc + in_register_0000151c;
  auVar298._0_4_ = fVar213 * auVar16._0_4_ + fVar211 * auVar17._0_4_ + auVar18._0_4_ * fVar193;
  auVar298._4_4_ = fVar235 * auVar16._4_4_ + fVar233 * auVar17._4_4_ + auVar18._4_4_ * fVar216;
  auVar298._8_4_ = fVar214 * auVar16._8_4_ + fVar212 * auVar17._8_4_ + auVar18._8_4_ * fVar210;
  auVar298._12_4_ = fVar237 * auVar16._12_4_ + fVar234 * auVar17._12_4_ + auVar18._12_4_ * fVar232;
  auVar298._16_4_ = fVar213 * auVar16._16_4_ + fVar211 * auVar17._16_4_ + auVar18._16_4_ * fVar193;
  auVar298._20_4_ = fVar235 * auVar16._20_4_ + fVar233 * auVar17._20_4_ + auVar18._20_4_ * fVar216;
  auVar298._24_4_ = fVar214 * auVar16._24_4_ + fVar212 * auVar17._24_4_ + auVar18._24_4_ * fVar210;
  auVar298._28_4_ = fVar234 + in_register_000015dc + in_register_0000159c;
  auVar206._0_4_ = fVar213 * auVar19._0_4_ + fVar211 * auVar20._0_4_ + auVar21._0_4_ * fVar193;
  auVar206._4_4_ = fVar235 * auVar19._4_4_ + fVar233 * auVar20._4_4_ + auVar21._4_4_ * fVar216;
  auVar206._8_4_ = fVar214 * auVar19._8_4_ + fVar212 * auVar20._8_4_ + auVar21._8_4_ * fVar210;
  auVar206._12_4_ = fVar237 * auVar19._12_4_ + fVar234 * auVar20._12_4_ + auVar21._12_4_ * fVar232;
  auVar206._16_4_ = fVar213 * auVar19._16_4_ + fVar211 * auVar20._16_4_ + auVar21._16_4_ * fVar193;
  auVar206._20_4_ = fVar235 * auVar19._20_4_ + fVar233 * auVar20._20_4_ + auVar21._20_4_ * fVar216;
  auVar206._24_4_ = fVar214 * auVar19._24_4_ + fVar212 * auVar20._24_4_ + auVar21._24_4_ * fVar210;
  auVar206._28_4_ = fVar237 + fVar234 + fVar232;
  auVar81 = vshufps_avx(auVar102,auVar102,0);
  auVar256 = vshufps_avx(auVar102,auVar102,0x55);
  auVar148 = vshufps_avx(auVar102,auVar102,0xaa);
  fVar216 = auVar148._0_4_;
  fVar210 = auVar148._4_4_;
  fVar232 = auVar148._8_4_;
  fVar211 = auVar148._12_4_;
  fVar235 = auVar256._0_4_;
  fVar214 = auVar256._4_4_;
  fVar237 = auVar256._8_4_;
  fVar215 = auVar256._12_4_;
  fVar233 = auVar81._0_4_;
  fVar212 = auVar81._4_4_;
  fVar234 = auVar81._8_4_;
  fVar213 = auVar81._12_4_;
  fVar193 = auVar92._28_4_;
  auVar125._0_4_ = fVar233 * auVar92._0_4_ + fVar235 * auVar14._0_4_ + fVar216 * auVar15._0_4_;
  auVar125._4_4_ = fVar212 * auVar92._4_4_ + fVar214 * auVar14._4_4_ + fVar210 * auVar15._4_4_;
  auVar125._8_4_ = fVar234 * auVar92._8_4_ + fVar237 * auVar14._8_4_ + fVar232 * auVar15._8_4_;
  auVar125._12_4_ = fVar213 * auVar92._12_4_ + fVar215 * auVar14._12_4_ + fVar211 * auVar15._12_4_;
  auVar125._16_4_ = fVar233 * auVar92._16_4_ + fVar235 * auVar14._16_4_ + fVar216 * auVar15._16_4_;
  auVar125._20_4_ = fVar212 * auVar92._20_4_ + fVar214 * auVar14._20_4_ + fVar210 * auVar15._20_4_;
  auVar125._24_4_ = fVar234 * auVar92._24_4_ + fVar237 * auVar14._24_4_ + fVar232 * auVar15._24_4_;
  auVar125._28_4_ = fVar193 + auVar14._28_4_ + auVar15._28_4_;
  auVar151._0_4_ = fVar233 * auVar16._0_4_ + auVar18._0_4_ * fVar216 + fVar235 * auVar17._0_4_;
  auVar151._4_4_ = fVar212 * auVar16._4_4_ + auVar18._4_4_ * fVar210 + fVar214 * auVar17._4_4_;
  auVar151._8_4_ = fVar234 * auVar16._8_4_ + auVar18._8_4_ * fVar232 + fVar237 * auVar17._8_4_;
  auVar151._12_4_ = fVar213 * auVar16._12_4_ + auVar18._12_4_ * fVar211 + fVar215 * auVar17._12_4_;
  auVar151._16_4_ = fVar233 * auVar16._16_4_ + auVar18._16_4_ * fVar216 + fVar235 * auVar17._16_4_;
  auVar151._20_4_ = fVar212 * auVar16._20_4_ + auVar18._20_4_ * fVar210 + fVar214 * auVar17._20_4_;
  auVar151._24_4_ = fVar234 * auVar16._24_4_ + auVar18._24_4_ * fVar232 + fVar237 * auVar17._24_4_;
  auVar151._28_4_ = fVar193 + auVar18._28_4_ + auVar15._28_4_;
  auVar163._8_4_ = 0x7fffffff;
  auVar163._0_8_ = 0x7fffffff7fffffff;
  auVar163._12_4_ = 0x7fffffff;
  auVar163._16_4_ = 0x7fffffff;
  auVar163._20_4_ = 0x7fffffff;
  auVar163._24_4_ = 0x7fffffff;
  auVar163._28_4_ = 0x7fffffff;
  auVar184._8_4_ = 0x219392ef;
  auVar184._0_8_ = 0x219392ef219392ef;
  auVar184._12_4_ = 0x219392ef;
  auVar184._16_4_ = 0x219392ef;
  auVar184._20_4_ = 0x219392ef;
  auVar184._24_4_ = 0x219392ef;
  auVar184._28_4_ = 0x219392ef;
  auVar92 = vandps_avx(auVar306,auVar163);
  auVar92 = vcmpps_avx(auVar92,auVar184,1);
  auVar14 = vblendvps_avx(auVar306,auVar184,auVar92);
  auVar92 = vandps_avx(auVar298,auVar163);
  auVar92 = vcmpps_avx(auVar92,auVar184,1);
  auVar15 = vblendvps_avx(auVar298,auVar184,auVar92);
  auVar92 = vandps_avx(auVar206,auVar163);
  auVar92 = vcmpps_avx(auVar92,auVar184,1);
  auVar92 = vblendvps_avx(auVar206,auVar184,auVar92);
  auVar164._0_4_ = fVar233 * auVar19._0_4_ + fVar235 * auVar20._0_4_ + auVar21._0_4_ * fVar216;
  auVar164._4_4_ = fVar212 * auVar19._4_4_ + fVar214 * auVar20._4_4_ + auVar21._4_4_ * fVar210;
  auVar164._8_4_ = fVar234 * auVar19._8_4_ + fVar237 * auVar20._8_4_ + auVar21._8_4_ * fVar232;
  auVar164._12_4_ = fVar213 * auVar19._12_4_ + fVar215 * auVar20._12_4_ + auVar21._12_4_ * fVar211;
  auVar164._16_4_ = fVar233 * auVar19._16_4_ + fVar235 * auVar20._16_4_ + auVar21._16_4_ * fVar216;
  auVar164._20_4_ = fVar212 * auVar19._20_4_ + fVar214 * auVar20._20_4_ + auVar21._20_4_ * fVar210;
  auVar164._24_4_ = fVar234 * auVar19._24_4_ + fVar237 * auVar20._24_4_ + auVar21._24_4_ * fVar232;
  auVar164._28_4_ = fVar193 + auVar17._28_4_ + fVar211;
  auVar16 = vrcpps_avx(auVar14);
  fVar193 = auVar16._0_4_;
  fVar210 = auVar16._4_4_;
  auVar17._4_4_ = auVar14._4_4_ * fVar210;
  auVar17._0_4_ = auVar14._0_4_ * fVar193;
  fVar211 = auVar16._8_4_;
  auVar17._8_4_ = auVar14._8_4_ * fVar211;
  fVar212 = auVar16._12_4_;
  auVar17._12_4_ = auVar14._12_4_ * fVar212;
  fVar213 = auVar16._16_4_;
  auVar17._16_4_ = auVar14._16_4_ * fVar213;
  fVar214 = auVar16._20_4_;
  auVar17._20_4_ = auVar14._20_4_ * fVar214;
  fVar215 = auVar16._24_4_;
  auVar17._24_4_ = auVar14._24_4_ * fVar215;
  auVar17._28_4_ = auVar206._28_4_;
  auVar247._8_4_ = 0x3f800000;
  auVar247._0_8_ = 0x3f8000003f800000;
  auVar247._12_4_ = 0x3f800000;
  auVar247._16_4_ = 0x3f800000;
  auVar247._20_4_ = 0x3f800000;
  auVar247._24_4_ = 0x3f800000;
  auVar247._28_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar247,auVar17);
  auVar14 = vrcpps_avx(auVar15);
  fVar193 = fVar193 + fVar193 * auVar17._0_4_;
  fVar210 = fVar210 + fVar210 * auVar17._4_4_;
  fVar211 = fVar211 + fVar211 * auVar17._8_4_;
  fVar212 = fVar212 + fVar212 * auVar17._12_4_;
  fVar213 = fVar213 + fVar213 * auVar17._16_4_;
  fVar214 = fVar214 + fVar214 * auVar17._20_4_;
  fVar215 = fVar215 + fVar215 * auVar17._24_4_;
  fVar216 = auVar14._0_4_;
  fVar232 = auVar14._4_4_;
  auVar18._4_4_ = auVar15._4_4_ * fVar232;
  auVar18._0_4_ = auVar15._0_4_ * fVar216;
  fVar233 = auVar14._8_4_;
  auVar18._8_4_ = auVar15._8_4_ * fVar233;
  fVar234 = auVar14._12_4_;
  auVar18._12_4_ = auVar15._12_4_ * fVar234;
  fVar235 = auVar14._16_4_;
  auVar18._16_4_ = auVar15._16_4_ * fVar235;
  fVar237 = auVar14._20_4_;
  auVar18._20_4_ = auVar15._20_4_ * fVar237;
  fVar238 = auVar14._24_4_;
  auVar18._24_4_ = auVar15._24_4_ * fVar238;
  auVar18._28_4_ = auVar16._28_4_;
  auVar14 = vsubps_avx(auVar247,auVar18);
  fVar216 = fVar216 + fVar216 * auVar14._0_4_;
  fVar232 = fVar232 + fVar232 * auVar14._4_4_;
  fVar233 = fVar233 + fVar233 * auVar14._8_4_;
  fVar234 = fVar234 + fVar234 * auVar14._12_4_;
  fVar235 = fVar235 + fVar235 * auVar14._16_4_;
  fVar237 = fVar237 + fVar237 * auVar14._20_4_;
  fVar238 = fVar238 + fVar238 * auVar14._24_4_;
  auVar14 = vrcpps_avx(auVar92);
  fVar167 = auVar14._0_4_;
  fVar187 = auVar14._4_4_;
  auVar15._4_4_ = fVar187 * auVar92._4_4_;
  auVar15._0_4_ = fVar167 * auVar92._0_4_;
  fVar188 = auVar14._8_4_;
  auVar15._8_4_ = fVar188 * auVar92._8_4_;
  fVar189 = auVar14._12_4_;
  auVar15._12_4_ = fVar189 * auVar92._12_4_;
  fVar190 = auVar14._16_4_;
  auVar15._16_4_ = fVar190 * auVar92._16_4_;
  fVar191 = auVar14._20_4_;
  auVar15._20_4_ = fVar191 * auVar92._20_4_;
  fVar192 = auVar14._24_4_;
  auVar15._24_4_ = fVar192 * auVar92._24_4_;
  auVar15._28_4_ = auVar92._28_4_;
  auVar92 = vsubps_avx(auVar247,auVar15);
  fVar167 = fVar167 + fVar167 * auVar92._0_4_;
  fVar187 = fVar187 + fVar187 * auVar92._4_4_;
  fVar188 = fVar188 + fVar188 * auVar92._8_4_;
  fVar189 = fVar189 + fVar189 * auVar92._12_4_;
  fVar190 = fVar190 + fVar190 * auVar92._16_4_;
  fVar191 = fVar191 + fVar191 * auVar92._20_4_;
  fVar192 = fVar192 + fVar192 * auVar92._24_4_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar72 * 7 + 6);
  auVar81 = vpmovsxwd_avx(auVar81);
  auVar256._8_8_ = 0;
  auVar256._0_8_ = *(ulong *)(prim + uVar72 * 7 + 0xe);
  auVar256 = vpmovsxwd_avx(auVar256);
  auVar93._16_16_ = auVar256;
  auVar93._0_16_ = auVar81;
  auVar92 = vcvtdq2ps_avx(auVar93);
  auVar92 = vsubps_avx(auVar92,auVar125);
  auVar73._0_4_ = fVar193 * auVar92._0_4_;
  auVar73._4_4_ = fVar210 * auVar92._4_4_;
  auVar73._8_4_ = fVar211 * auVar92._8_4_;
  auVar73._12_4_ = fVar212 * auVar92._12_4_;
  auVar16._16_4_ = fVar213 * auVar92._16_4_;
  auVar16._0_16_ = auVar73;
  auVar16._20_4_ = fVar214 * auVar92._20_4_;
  auVar16._24_4_ = fVar215 * auVar92._24_4_;
  auVar16._28_4_ = auVar92._28_4_;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = *(ulong *)(prim + lVar13 + 6);
  auVar81 = vpmovsxwd_avx(auVar148);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(prim + lVar13 + 0xe);
  auVar256 = vpmovsxwd_avx(auVar120);
  auVar248._16_16_ = auVar256;
  auVar248._0_16_ = auVar81;
  auVar92 = vcvtdq2ps_avx(auVar248);
  auVar92 = vsubps_avx(auVar92,auVar125);
  auVar103._0_4_ = fVar193 * auVar92._0_4_;
  auVar103._4_4_ = fVar210 * auVar92._4_4_;
  auVar103._8_4_ = fVar211 * auVar92._8_4_;
  auVar103._12_4_ = fVar212 * auVar92._12_4_;
  auVar19._16_4_ = fVar213 * auVar92._16_4_;
  auVar19._0_16_ = auVar103;
  auVar19._20_4_ = fVar214 * auVar92._20_4_;
  auVar19._24_4_ = fVar215 * auVar92._24_4_;
  auVar19._28_4_ = auVar92._28_4_;
  lVar70 = (ulong)(byte)PVar8 * 0x10;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + lVar70 + 6);
  auVar81 = vpmovsxwd_avx(auVar109);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + lVar70 + 0xe);
  auVar256 = vpmovsxwd_avx(auVar138);
  lVar70 = lVar70 + uVar72 * -2;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + lVar70 + 6);
  auVar148 = vpmovsxwd_avx(auVar110);
  auVar236._8_8_ = 0;
  auVar236._0_8_ = *(ulong *)(prim + lVar70 + 0xe);
  auVar120 = vpmovsxwd_avx(auVar236);
  auVar207._16_16_ = auVar120;
  auVar207._0_16_ = auVar148;
  auVar92 = vcvtdq2ps_avx(auVar207);
  auVar92 = vsubps_avx(auVar92,auVar151);
  auVar195._0_4_ = fVar216 * auVar92._0_4_;
  auVar195._4_4_ = fVar232 * auVar92._4_4_;
  auVar195._8_4_ = fVar233 * auVar92._8_4_;
  auVar195._12_4_ = fVar234 * auVar92._12_4_;
  auVar20._16_4_ = fVar235 * auVar92._16_4_;
  auVar20._0_16_ = auVar195;
  auVar20._20_4_ = fVar237 * auVar92._20_4_;
  auVar20._24_4_ = fVar238 * auVar92._24_4_;
  auVar20._28_4_ = auVar92._28_4_;
  auVar249._16_16_ = auVar256;
  auVar249._0_16_ = auVar81;
  auVar92 = vcvtdq2ps_avx(auVar249);
  auVar92 = vsubps_avx(auVar92,auVar151);
  auVar133._0_4_ = fVar216 * auVar92._0_4_;
  auVar133._4_4_ = fVar232 * auVar92._4_4_;
  auVar133._8_4_ = fVar233 * auVar92._8_4_;
  auVar133._12_4_ = fVar234 * auVar92._12_4_;
  auVar21._16_4_ = fVar235 * auVar92._16_4_;
  auVar21._0_16_ = auVar133;
  auVar21._20_4_ = fVar237 * auVar92._20_4_;
  auVar21._24_4_ = fVar238 * auVar92._24_4_;
  auVar21._28_4_ = auVar92._28_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar71 + uVar72 + 6);
  auVar81 = vpmovsxwd_avx(auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar71 + uVar72 + 0xe);
  auVar256 = vpmovsxwd_avx(auVar6);
  auVar229._16_16_ = auVar256;
  auVar229._0_16_ = auVar81;
  auVar92 = vcvtdq2ps_avx(auVar229);
  auVar92 = vsubps_avx(auVar92,auVar164);
  auVar217._0_4_ = fVar167 * auVar92._0_4_;
  auVar217._4_4_ = fVar187 * auVar92._4_4_;
  auVar217._8_4_ = fVar188 * auVar92._8_4_;
  auVar217._12_4_ = fVar189 * auVar92._12_4_;
  auVar22._16_4_ = fVar190 * auVar92._16_4_;
  auVar22._0_16_ = auVar217;
  auVar22._20_4_ = fVar191 * auVar92._20_4_;
  auVar22._24_4_ = fVar192 * auVar92._24_4_;
  auVar22._28_4_ = auVar92._28_4_;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + uVar72 * 0x17 + 6);
  auVar81 = vpmovsxwd_avx(auVar223);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar72 * 0x17 + 0xe);
  auVar256 = vpmovsxwd_avx(auVar7);
  auVar250._16_16_ = auVar256;
  auVar250._0_16_ = auVar81;
  auVar92 = vcvtdq2ps_avx(auVar250);
  auVar92 = vsubps_avx(auVar92,auVar164);
  auVar156._0_4_ = fVar167 * auVar92._0_4_;
  auVar156._4_4_ = fVar187 * auVar92._4_4_;
  auVar156._8_4_ = fVar188 * auVar92._8_4_;
  auVar156._12_4_ = fVar189 * auVar92._12_4_;
  auVar23._16_4_ = fVar190 * auVar92._16_4_;
  auVar23._0_16_ = auVar156;
  auVar23._20_4_ = fVar191 * auVar92._20_4_;
  auVar23._24_4_ = fVar192 * auVar92._24_4_;
  auVar23._28_4_ = auVar92._28_4_;
  auVar81 = vpminsd_avx(auVar16._16_16_,auVar19._16_16_);
  auVar256 = vpminsd_avx(auVar73,auVar103);
  auVar291._16_16_ = auVar81;
  auVar291._0_16_ = auVar256;
  auVar81 = vpminsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar256 = vpminsd_avx(auVar195,auVar133);
  auVar299._16_16_ = auVar81;
  auVar299._0_16_ = auVar256;
  auVar92 = vmaxps_avx(auVar291,auVar299);
  auVar81 = vpminsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar256 = vpminsd_avx(auVar217,auVar156);
  auVar317._16_16_ = auVar81;
  auVar317._0_16_ = auVar256;
  uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar323._4_4_ = uVar2;
  auVar323._0_4_ = uVar2;
  auVar323._8_4_ = uVar2;
  auVar323._12_4_ = uVar2;
  auVar323._16_4_ = uVar2;
  auVar323._20_4_ = uVar2;
  auVar323._24_4_ = uVar2;
  auVar323._28_4_ = uVar2;
  auVar14 = vmaxps_avx(auVar317,auVar323);
  auVar92 = vmaxps_avx(auVar92,auVar14);
  local_198._4_4_ = auVar92._4_4_ * 0.99999964;
  local_198._0_4_ = auVar92._0_4_ * 0.99999964;
  local_198._8_4_ = auVar92._8_4_ * 0.99999964;
  local_198._12_4_ = auVar92._12_4_ * 0.99999964;
  local_198._16_4_ = auVar92._16_4_ * 0.99999964;
  local_198._20_4_ = auVar92._20_4_ * 0.99999964;
  local_198._24_4_ = auVar92._24_4_ * 0.99999964;
  local_198._28_4_ = auVar92._28_4_;
  auVar81 = vpmaxsd_avx(auVar16._16_16_,auVar19._16_16_);
  auVar256 = vpmaxsd_avx(auVar73,auVar103);
  auVar94._16_16_ = auVar81;
  auVar94._0_16_ = auVar256;
  auVar81 = vpmaxsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar256 = vpmaxsd_avx(auVar195,auVar133);
  auVar126._16_16_ = auVar81;
  auVar126._0_16_ = auVar256;
  auVar92 = vminps_avx(auVar94,auVar126);
  auVar81 = vpmaxsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar256 = vpmaxsd_avx(auVar217,auVar156);
  auVar127._16_16_ = auVar81;
  auVar127._0_16_ = auVar256;
  fVar193 = ray->tfar;
  auVar152._4_4_ = fVar193;
  auVar152._0_4_ = fVar193;
  auVar152._8_4_ = fVar193;
  auVar152._12_4_ = fVar193;
  auVar152._16_4_ = fVar193;
  auVar152._20_4_ = fVar193;
  auVar152._24_4_ = fVar193;
  auVar152._28_4_ = fVar193;
  auVar14 = vminps_avx(auVar127,auVar152);
  auVar92 = vminps_avx(auVar92,auVar14);
  auVar14._4_4_ = auVar92._4_4_ * 1.0000004;
  auVar14._0_4_ = auVar92._0_4_ * 1.0000004;
  auVar14._8_4_ = auVar92._8_4_ * 1.0000004;
  auVar14._12_4_ = auVar92._12_4_ * 1.0000004;
  auVar14._16_4_ = auVar92._16_4_ * 1.0000004;
  auVar14._20_4_ = auVar92._20_4_ * 1.0000004;
  auVar14._24_4_ = auVar92._24_4_ * 1.0000004;
  auVar14._28_4_ = auVar92._28_4_;
  auVar92 = vcmpps_avx(local_198,auVar14,2);
  auVar81 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar128._16_16_ = auVar81;
  auVar128._0_16_ = auVar81;
  auVar14 = vcvtdq2ps_avx(auVar128);
  auVar14 = vcmpps_avx(_DAT_01faff40,auVar14,1);
  auVar92 = vandps_avx(auVar92,auVar14);
  uVar66 = vmovmskps_avx(auVar92);
  if (uVar66 == 0) {
    return false;
  }
  uVar66 = uVar66 & 0xff;
  auVar95._16_16_ = mm_lookupmask_ps._240_16_;
  auVar95._0_16_ = mm_lookupmask_ps._240_16_;
  local_178 = vblendps_avx(auVar95,ZEXT832(0) << 0x20,0x80);
LAB_01033576:
  uVar72 = (ulong)uVar66;
  lVar70 = 0;
  if (uVar72 != 0) {
    for (; (uVar66 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
    }
  }
  local_420 = (ulong)*(uint *)(prim + 2);
  local_320 = (ulong)*(uint *)(prim + lVar70 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[local_420].ptr;
  uVar71 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_320);
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var12 + uVar71 * (long)pvVar11);
  fVar193 = *pfVar1;
  fVar216 = pfVar1[1];
  fVar210 = pfVar1[2];
  fVar232 = pfVar1[3];
  pfVar1 = (float *)(_Var12 + (uVar71 + 1) * (long)pvVar11);
  fVar211 = *pfVar1;
  fVar233 = pfVar1[1];
  fVar212 = pfVar1[2];
  fVar234 = pfVar1[3];
  auVar81 = *(undefined1 (*) [16])(_Var12 + (uVar71 + 2) * (long)pvVar11);
  pfVar1 = (float *)(_Var12 + (long)pvVar11 * (uVar71 + 3));
  fVar213 = *pfVar1;
  fVar235 = pfVar1[1];
  fVar214 = pfVar1[2];
  fVar237 = pfVar1[3];
  uVar72 = uVar72 - 1 & uVar72;
  lVar70 = *(long *)&pGVar9[1].time_range.upper;
  pfVar1 = (float *)(lVar70 + (long)p_Var10 * uVar71);
  fVar215 = *pfVar1;
  fVar238 = pfVar1[1];
  fVar167 = pfVar1[2];
  fVar187 = pfVar1[3];
  pfVar1 = (float *)(lVar70 + (long)p_Var10 * (uVar71 + 1));
  fVar188 = *pfVar1;
  fVar189 = pfVar1[1];
  fVar190 = pfVar1[2];
  fVar191 = pfVar1[3];
  pfVar1 = (float *)(lVar70 + (long)p_Var10 * (uVar71 + 2));
  fVar192 = *pfVar1;
  fVar166 = pfVar1[1];
  fVar264 = pfVar1[2];
  fVar302 = pfVar1[3];
  lVar13 = 0;
  if (uVar72 != 0) {
    for (; (uVar72 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
    }
  }
  pfVar1 = (float *)(lVar70 + (long)p_Var10 * (uVar71 + 3));
  fVar265 = *pfVar1;
  fVar307 = pfVar1[1];
  fVar266 = pfVar1[2];
  fVar308 = pfVar1[3];
  if (((uVar72 != 0) && (uVar71 = uVar72 - 1 & uVar72, uVar71 != 0)) && (lVar70 = 0, uVar71 != 0)) {
    for (; (uVar71 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
    }
  }
  local_498._0_4_ =
       fVar215 * 0.16666667 + fVar188 * 0.6666667 + fVar192 * 0.16666667 + fVar265 * 0.0;
  local_498._4_4_ =
       fVar238 * 0.16666667 + fVar189 * 0.6666667 + fVar166 * 0.16666667 + fVar307 * 0.0;
  fStack_490 = fVar167 * 0.16666667 + fVar190 * 0.6666667 + fVar264 * 0.16666667 + fVar266 * 0.0;
  fStack_48c = fVar187 * 0.16666667 + fVar191 * 0.6666667 + fVar302 * 0.16666667 + fVar308 * 0.0;
  auVar104._0_4_ = fVar192 * 0.5 + fVar265 * 0.0;
  auVar104._4_4_ = fVar166 * 0.5 + fVar307 * 0.0;
  auVar104._8_4_ = fVar264 * 0.5 + fVar266 * 0.0;
  auVar104._12_4_ = fVar302 * 0.5 + fVar308 * 0.0;
  auVar284._0_4_ = fVar188 * 0.0;
  auVar284._4_4_ = fVar189 * 0.0;
  auVar284._8_4_ = fVar190 * 0.0;
  auVar284._12_4_ = fVar191 * 0.0;
  auVar256 = vsubps_avx(auVar104,auVar284);
  auVar285._0_4_ = fVar215 * 0.5;
  auVar285._4_4_ = fVar238 * 0.5;
  auVar285._8_4_ = fVar167 * 0.5;
  auVar285._12_4_ = fVar187 * 0.5;
  auVar236 = vsubps_avx(auVar256,auVar285);
  fVar267 = auVar81._0_4_;
  fVar309 = auVar81._4_4_;
  fVar268 = auVar81._8_4_;
  fVar278 = auVar81._12_4_;
  auVar286._0_4_ = fVar193 * 0.16666667 + fVar211 * 0.6666667 + fVar267 * 0.16666667 + fVar213 * 0.0
  ;
  auVar286._4_4_ = fVar216 * 0.16666667 + fVar233 * 0.6666667 + fVar309 * 0.16666667 + fVar235 * 0.0
  ;
  auVar286._8_4_ = fVar210 * 0.16666667 + fVar212 * 0.6666667 + fVar268 * 0.16666667 + fVar214 * 0.0
  ;
  auVar286._12_4_ =
       fVar232 * 0.16666667 + fVar234 * 0.6666667 + fVar278 * 0.16666667 + fVar237 * 0.0;
  auVar293._0_4_ = fVar267 * 0.5 + fVar213 * 0.0;
  auVar293._4_4_ = fVar309 * 0.5 + fVar235 * 0.0;
  auVar293._8_4_ = fVar268 * 0.5 + fVar214 * 0.0;
  auVar293._12_4_ = fVar278 * 0.5 + fVar237 * 0.0;
  auVar303._0_4_ = fVar211 * 0.0;
  auVar303._4_4_ = fVar233 * 0.0;
  auVar303._8_4_ = fVar212 * 0.0;
  auVar303._12_4_ = fVar234 * 0.0;
  auVar81 = vsubps_avx(auVar293,auVar303);
  auVar304._0_4_ = fVar193 * 0.5;
  auVar304._4_4_ = fVar216 * 0.5;
  auVar304._8_4_ = fVar210 * 0.5;
  auVar304._12_4_ = fVar232 * 0.5;
  auVar120 = vsubps_avx(auVar81,auVar304);
  auVar314._0_4_ = fVar215 * 0.0;
  auVar314._4_4_ = fVar238 * 0.0;
  auVar314._8_4_ = fVar167 * 0.0;
  auVar314._12_4_ = fVar187 * 0.0;
  local_448._0_4_ =
       auVar314._0_4_ + fVar188 * 0.16666667 + fVar192 * 0.6666667 + fVar265 * 0.16666667;
  local_448._4_4_ =
       auVar314._4_4_ + fVar189 * 0.16666667 + fVar166 * 0.6666667 + fVar307 * 0.16666667;
  fStack_440 = auVar314._8_4_ + fVar190 * 0.16666667 + fVar264 * 0.6666667 + fVar266 * 0.16666667;
  fStack_43c = auVar314._12_4_ + fVar191 * 0.16666667 + fVar302 * 0.6666667 + fVar308 * 0.16666667;
  auVar252._0_4_ = fVar192 * 0.0 + fVar265 * 0.5;
  auVar252._4_4_ = fVar166 * 0.0 + fVar307 * 0.5;
  auVar252._8_4_ = fVar264 * 0.0 + fVar266 * 0.5;
  auVar252._12_4_ = fVar302 * 0.0 + fVar308 * 0.5;
  auVar157._0_4_ = fVar188 * 0.5;
  auVar157._4_4_ = fVar189 * 0.5;
  auVar157._8_4_ = fVar190 * 0.5;
  auVar157._12_4_ = fVar191 * 0.5;
  auVar81 = vsubps_avx(auVar252,auVar157);
  auVar5 = vsubps_avx(auVar81,auVar314);
  auVar196._0_4_ = fVar193 * 0.0;
  auVar196._4_4_ = fVar216 * 0.0;
  auVar196._8_4_ = fVar210 * 0.0;
  auVar196._12_4_ = fVar232 * 0.0;
  auVar253._0_4_ =
       fVar211 * 0.16666667 + fVar267 * 0.6666667 + fVar213 * 0.16666667 + auVar196._0_4_;
  auVar253._4_4_ =
       fVar233 * 0.16666667 + fVar309 * 0.6666667 + fVar235 * 0.16666667 + auVar196._4_4_;
  auVar253._8_4_ =
       fVar212 * 0.16666667 + fVar268 * 0.6666667 + fVar214 * 0.16666667 + auVar196._8_4_;
  auVar253._12_4_ =
       fVar234 * 0.16666667 + fVar278 * 0.6666667 + fVar237 * 0.16666667 + auVar196._12_4_;
  auVar218._0_4_ = fVar267 * 0.0 + fVar213 * 0.5;
  auVar218._4_4_ = fVar309 * 0.0 + fVar235 * 0.5;
  auVar218._8_4_ = fVar268 * 0.0 + fVar214 * 0.5;
  auVar218._12_4_ = fVar278 * 0.0 + fVar237 * 0.5;
  auVar168._0_4_ = fVar211 * 0.5;
  auVar168._4_4_ = fVar233 * 0.5;
  auVar168._8_4_ = fVar212 * 0.5;
  auVar168._12_4_ = fVar234 * 0.5;
  auVar81 = vsubps_avx(auVar218,auVar168);
  auVar138 = vsubps_avx(auVar81,auVar196);
  auVar81 = vshufps_avx(auVar236,auVar236,0xc9);
  auVar256 = vshufps_avx(auVar286,auVar286,0xc9);
  fVar167 = auVar236._0_4_;
  auVar219._0_4_ = fVar167 * auVar256._0_4_;
  fVar187 = auVar236._4_4_;
  auVar219._4_4_ = fVar187 * auVar256._4_4_;
  fVar188 = auVar236._8_4_;
  auVar219._8_4_ = fVar188 * auVar256._8_4_;
  fVar189 = auVar236._12_4_;
  auVar219._12_4_ = fVar189 * auVar256._12_4_;
  auVar239._0_4_ = auVar286._0_4_ * auVar81._0_4_;
  auVar239._4_4_ = auVar286._4_4_ * auVar81._4_4_;
  auVar239._8_4_ = auVar286._8_4_ * auVar81._8_4_;
  auVar239._12_4_ = auVar286._12_4_ * auVar81._12_4_;
  auVar256 = vsubps_avx(auVar239,auVar219);
  auVar148 = vshufps_avx(auVar256,auVar256,0xc9);
  auVar256 = vshufps_avx(auVar120,auVar120,0xc9);
  auVar220._0_4_ = fVar167 * auVar256._0_4_;
  auVar220._4_4_ = fVar187 * auVar256._4_4_;
  auVar220._8_4_ = fVar188 * auVar256._8_4_;
  auVar220._12_4_ = fVar189 * auVar256._12_4_;
  auVar169._0_4_ = auVar120._0_4_ * auVar81._0_4_;
  auVar169._4_4_ = auVar120._4_4_ * auVar81._4_4_;
  auVar169._8_4_ = auVar120._8_4_ * auVar81._8_4_;
  auVar169._12_4_ = auVar120._12_4_ * auVar81._12_4_;
  auVar81 = vsubps_avx(auVar169,auVar220);
  auVar120 = vshufps_avx(auVar81,auVar81,0xc9);
  auVar81 = vshufps_avx(auVar5,auVar5,0xc9);
  auVar256 = vshufps_avx(auVar253,auVar253,0xc9);
  fVar190 = auVar5._0_4_;
  auVar170._0_4_ = fVar190 * auVar256._0_4_;
  fVar191 = auVar5._4_4_;
  auVar170._4_4_ = fVar191 * auVar256._4_4_;
  fVar192 = auVar5._8_4_;
  auVar170._8_4_ = fVar192 * auVar256._8_4_;
  fVar166 = auVar5._12_4_;
  auVar170._12_4_ = fVar166 * auVar256._12_4_;
  auVar254._0_4_ = auVar253._0_4_ * auVar81._0_4_;
  auVar254._4_4_ = auVar253._4_4_ * auVar81._4_4_;
  auVar254._8_4_ = auVar253._8_4_ * auVar81._8_4_;
  auVar254._12_4_ = auVar253._12_4_ * auVar81._12_4_;
  auVar256 = vsubps_avx(auVar254,auVar170);
  auVar109 = vshufps_avx(auVar256,auVar256,0xc9);
  auVar256 = vshufps_avx(auVar138,auVar138,0xc9);
  auVar255._0_4_ = auVar256._0_4_ * fVar190;
  auVar255._4_4_ = auVar256._4_4_ * fVar191;
  auVar255._8_4_ = auVar256._8_4_ * fVar192;
  auVar255._12_4_ = auVar256._12_4_ * fVar166;
  auVar197._0_4_ = auVar81._0_4_ * auVar138._0_4_;
  auVar197._4_4_ = auVar81._4_4_ * auVar138._4_4_;
  auVar197._8_4_ = auVar81._8_4_ * auVar138._8_4_;
  auVar197._12_4_ = auVar81._12_4_ * auVar138._12_4_;
  auVar256 = vsubps_avx(auVar197,auVar255);
  auVar81 = vdpps_avx(auVar148,auVar148,0x7f);
  auVar138 = vshufps_avx(auVar256,auVar256,0xc9);
  fVar211 = auVar81._0_4_;
  auVar223 = ZEXT416((uint)fVar211);
  auVar256 = vrsqrtss_avx(auVar223,auVar223);
  fVar193 = auVar256._0_4_;
  auVar256 = vdpps_avx(auVar148,auVar120,0x7f);
  auVar110 = ZEXT416((uint)(fVar193 * 1.5 - fVar211 * 0.5 * fVar193 * fVar193 * fVar193));
  auVar110 = vshufps_avx(auVar110,auVar110,0);
  fVar193 = auVar110._0_4_ * auVar148._0_4_;
  fVar216 = auVar110._4_4_ * auVar148._4_4_;
  fVar210 = auVar110._8_4_ * auVar148._8_4_;
  fVar232 = auVar110._12_4_ * auVar148._12_4_;
  auVar81 = vshufps_avx(auVar81,auVar81,0);
  auVar269._0_4_ = auVar120._0_4_ * auVar81._0_4_;
  auVar269._4_4_ = auVar120._4_4_ * auVar81._4_4_;
  auVar269._8_4_ = auVar120._8_4_ * auVar81._8_4_;
  auVar269._12_4_ = auVar120._12_4_ * auVar81._12_4_;
  auVar81 = vshufps_avx(auVar256,auVar256,0);
  auVar240._0_4_ = auVar81._0_4_ * auVar148._0_4_;
  auVar240._4_4_ = auVar81._4_4_ * auVar148._4_4_;
  auVar240._8_4_ = auVar81._8_4_ * auVar148._8_4_;
  auVar240._12_4_ = auVar81._12_4_ * auVar148._12_4_;
  auVar6 = vsubps_avx(auVar269,auVar240);
  auVar256 = vrcpss_avx(auVar223,auVar223);
  auVar81 = vdpps_avx(auVar109,auVar109,0x7f);
  auVar256 = ZEXT416((uint)(auVar256._0_4_ * (2.0 - fVar211 * auVar256._0_4_)));
  auVar148 = vshufps_avx(auVar256,auVar256,0);
  fVar211 = auVar81._0_4_;
  auVar223 = ZEXT416((uint)fVar211);
  auVar256 = vrsqrtss_avx(auVar223,auVar223);
  fVar233 = auVar256._0_4_;
  auVar256 = ZEXT416((uint)(fVar233 * 1.5 - fVar211 * 0.5 * fVar233 * fVar233 * fVar233));
  auVar120 = vshufps_avx(auVar256,auVar256,0);
  auVar256 = vdpps_avx(auVar109,auVar138,0x7f);
  fVar233 = auVar120._0_4_ * auVar109._0_4_;
  fVar212 = auVar120._4_4_ * auVar109._4_4_;
  fVar234 = auVar120._8_4_ * auVar109._8_4_;
  fVar213 = auVar120._12_4_ * auVar109._12_4_;
  auVar81 = vshufps_avx(auVar81,auVar81,0);
  auVar221._0_4_ = auVar81._0_4_ * auVar138._0_4_;
  auVar221._4_4_ = auVar81._4_4_ * auVar138._4_4_;
  auVar221._8_4_ = auVar81._8_4_ * auVar138._8_4_;
  auVar221._12_4_ = auVar81._12_4_ * auVar138._12_4_;
  auVar81 = vshufps_avx(auVar256,auVar256,0);
  auVar171._0_4_ = auVar81._0_4_ * auVar109._0_4_;
  auVar171._4_4_ = auVar81._4_4_ * auVar109._4_4_;
  auVar171._8_4_ = auVar81._8_4_ * auVar109._8_4_;
  auVar171._12_4_ = auVar81._12_4_ * auVar109._12_4_;
  auVar138 = vsubps_avx(auVar221,auVar171);
  auVar81 = vrcpss_avx(auVar223,auVar223);
  auVar81 = ZEXT416((uint)((2.0 - fVar211 * auVar81._0_4_) * auVar81._0_4_));
  auVar81 = vshufps_avx(auVar81,auVar81,0);
  auVar256 = vshufps_avx(_local_498,_local_498,0xff);
  auVar257._0_4_ = auVar256._0_4_ * fVar193;
  auVar257._4_4_ = auVar256._4_4_ * fVar216;
  auVar257._8_4_ = auVar256._8_4_ * fVar210;
  auVar257._12_4_ = auVar256._12_4_ * fVar232;
  _local_388 = vsubps_avx(_local_498,auVar257);
  auVar109 = vshufps_avx(auVar236,auVar236,0xff);
  auVar198._0_4_ =
       auVar109._0_4_ * fVar193 + auVar256._0_4_ * auVar110._0_4_ * auVar148._0_4_ * auVar6._0_4_;
  auVar198._4_4_ =
       auVar109._4_4_ * fVar216 + auVar256._4_4_ * auVar110._4_4_ * auVar148._4_4_ * auVar6._4_4_;
  auVar198._8_4_ =
       auVar109._8_4_ * fVar210 + auVar256._8_4_ * auVar110._8_4_ * auVar148._8_4_ * auVar6._8_4_;
  auVar198._12_4_ =
       auVar109._12_4_ * fVar232 +
       auVar256._12_4_ * auVar110._12_4_ * auVar148._12_4_ * auVar6._12_4_;
  auVar109 = vsubps_avx(auVar236,auVar198);
  local_398._0_4_ = auVar257._0_4_ + (float)local_498._0_4_;
  local_398._4_4_ = auVar257._4_4_ + (float)local_498._4_4_;
  fStack_390 = auVar257._8_4_ + fStack_490;
  fStack_38c = auVar257._12_4_ + fStack_48c;
  auVar256 = vshufps_avx(_local_448,_local_448,0xff);
  auVar105._0_4_ = fVar233 * auVar256._0_4_;
  auVar105._4_4_ = fVar212 * auVar256._4_4_;
  auVar105._8_4_ = fVar234 * auVar256._8_4_;
  auVar105._12_4_ = fVar213 * auVar256._12_4_;
  _local_3a8 = vsubps_avx(_local_448,auVar105);
  auVar148 = vshufps_avx(auVar5,auVar5,0xff);
  auVar74._0_4_ =
       fVar233 * auVar148._0_4_ + auVar256._0_4_ * auVar120._0_4_ * auVar138._0_4_ * auVar81._0_4_;
  auVar74._4_4_ =
       fVar212 * auVar148._4_4_ + auVar256._4_4_ * auVar120._4_4_ * auVar138._4_4_ * auVar81._4_4_;
  auVar74._8_4_ =
       fVar234 * auVar148._8_4_ + auVar256._8_4_ * auVar120._8_4_ * auVar138._8_4_ * auVar81._8_4_;
  auVar74._12_4_ =
       fVar213 * auVar148._12_4_ +
       auVar256._12_4_ * auVar120._12_4_ * auVar138._12_4_ * auVar81._12_4_;
  auVar81 = vsubps_avx(auVar5,auVar74);
  local_418 = (float)local_448._0_4_ + auVar105._0_4_;
  fStack_414 = (float)local_448._4_4_ + auVar105._4_4_;
  fStack_410 = fStack_440 + auVar105._8_4_;
  fStack_40c = fStack_43c + auVar105._12_4_;
  local_3b8._0_4_ = local_388._0_4_ + auVar109._0_4_ * 0.33333334;
  local_3b8._4_4_ = local_388._4_4_ + auVar109._4_4_ * 0.33333334;
  fStack_3b0 = local_388._8_4_ + auVar109._8_4_ * 0.33333334;
  fStack_3ac = local_388._12_4_ + auVar109._12_4_ * 0.33333334;
  auVar75._0_4_ = auVar81._0_4_ * 0.33333334;
  auVar75._4_4_ = auVar81._4_4_ * 0.33333334;
  auVar75._8_4_ = auVar81._8_4_ * 0.33333334;
  auVar75._12_4_ = auVar81._12_4_ * 0.33333334;
  _local_3c8 = vsubps_avx(_local_3a8,auVar75);
  aVar4 = (ray->org).field_0;
  auVar148 = vsubps_avx(_local_388,(undefined1  [16])aVar4);
  auVar256 = vmovsldup_avx(auVar148);
  auVar81 = vmovshdup_avx(auVar148);
  auVar148 = vshufps_avx(auVar148,auVar148,0xaa);
  fVar193 = (pre->ray_space).vx.field_0.m128[0];
  fVar216 = (pre->ray_space).vx.field_0.m128[1];
  fVar210 = (pre->ray_space).vx.field_0.m128[2];
  fVar232 = (pre->ray_space).vx.field_0.m128[3];
  fVar211 = (pre->ray_space).vy.field_0.m128[0];
  fVar233 = (pre->ray_space).vy.field_0.m128[1];
  fVar212 = (pre->ray_space).vy.field_0.m128[2];
  fVar234 = (pre->ray_space).vy.field_0.m128[3];
  fVar213 = (pre->ray_space).vz.field_0.m128[0];
  fVar235 = (pre->ray_space).vz.field_0.m128[1];
  fVar214 = (pre->ray_space).vz.field_0.m128[2];
  fVar237 = (pre->ray_space).vz.field_0.m128[3];
  local_498._0_4_ = fVar193 * auVar256._0_4_ + fVar211 * auVar81._0_4_ + fVar213 * auVar148._0_4_;
  local_498._4_4_ = fVar216 * auVar256._4_4_ + fVar233 * auVar81._4_4_ + fVar235 * auVar148._4_4_;
  fStack_490 = fVar210 * auVar256._8_4_ + fVar212 * auVar81._8_4_ + fVar214 * auVar148._8_4_;
  fStack_48c = fVar232 * auVar256._12_4_ + fVar234 * auVar81._12_4_ + fVar237 * auVar148._12_4_;
  auVar148 = vsubps_avx(_local_3b8,(undefined1  [16])aVar4);
  auVar256 = vmovsldup_avx(auVar148);
  auVar81 = vmovshdup_avx(auVar148);
  auVar148 = vshufps_avx(auVar148,auVar148,0xaa);
  fVar215 = fVar193 * auVar256._0_4_ + auVar81._0_4_ * fVar211 + fVar213 * auVar148._0_4_;
  fVar238 = fVar216 * auVar256._4_4_ + auVar81._4_4_ * fVar233 + fVar235 * auVar148._4_4_;
  local_468._4_4_ = fVar238;
  local_468._0_4_ = fVar215;
  fStack_460 = fVar210 * auVar256._8_4_ + auVar81._8_4_ * fVar212 + fVar214 * auVar148._8_4_;
  fStack_45c = fVar232 * auVar256._12_4_ + auVar81._12_4_ * fVar234 + fVar237 * auVar148._12_4_;
  auVar256 = vsubps_avx(_local_3c8,(undefined1  [16])aVar4);
  auVar148 = vshufps_avx(auVar256,auVar256,0xaa);
  auVar81 = vmovshdup_avx(auVar256);
  auVar256 = vmovsldup_avx(auVar256);
  auVar325._0_4_ = auVar81._0_4_ * fVar211 + auVar148._0_4_ * fVar213 + fVar193 * auVar256._0_4_;
  auVar325._4_4_ = auVar81._4_4_ * fVar233 + auVar148._4_4_ * fVar235 + fVar216 * auVar256._4_4_;
  auVar325._8_4_ = auVar81._8_4_ * fVar212 + auVar148._8_4_ * fVar214 + fVar210 * auVar256._8_4_;
  auVar325._12_4_ = auVar81._12_4_ * fVar234 + auVar148._12_4_ * fVar237 + fVar232 * auVar256._12_4_
  ;
  auVar256 = vsubps_avx(_local_3a8,(undefined1  [16])aVar4);
  auVar148 = vshufps_avx(auVar256,auVar256,0xaa);
  auVar81 = vmovshdup_avx(auVar256);
  auVar256 = vmovsldup_avx(auVar256);
  auVar319._0_4_ = auVar256._0_4_ * fVar193 + auVar81._0_4_ * fVar211 + auVar148._0_4_ * fVar213;
  auVar319._4_4_ = auVar256._4_4_ * fVar216 + auVar81._4_4_ * fVar233 + auVar148._4_4_ * fVar235;
  auVar319._8_4_ = auVar256._8_4_ * fVar210 + auVar81._8_4_ * fVar212 + auVar148._8_4_ * fVar214;
  auVar319._12_4_ = auVar256._12_4_ * fVar232 + auVar81._12_4_ * fVar234 + auVar148._12_4_ * fVar237
  ;
  auVar256 = vsubps_avx(_local_398,(undefined1  [16])aVar4);
  auVar148 = vshufps_avx(auVar256,auVar256,0xaa);
  auVar81 = vmovshdup_avx(auVar256);
  auVar256 = vmovsldup_avx(auVar256);
  auVar287._0_8_ =
       CONCAT44(auVar256._4_4_ * fVar216 + auVar81._4_4_ * fVar233 + auVar148._4_4_ * fVar235,
                auVar256._0_4_ * fVar193 + auVar81._0_4_ * fVar211 + auVar148._0_4_ * fVar213);
  auVar287._8_4_ = auVar256._8_4_ * fVar210 + auVar81._8_4_ * fVar212 + auVar148._8_4_ * fVar214;
  auVar287._12_4_ = auVar256._12_4_ * fVar232 + auVar81._12_4_ * fVar234 + auVar148._12_4_ * fVar237
  ;
  local_3d8._0_4_ = (fVar167 + auVar198._0_4_) * 0.33333334 + (float)local_398._0_4_;
  local_3d8._4_4_ = (fVar187 + auVar198._4_4_) * 0.33333334 + (float)local_398._4_4_;
  fStack_3d0 = (fVar188 + auVar198._8_4_) * 0.33333334 + fStack_390;
  fStack_3cc = (fVar189 + auVar198._12_4_) * 0.33333334 + fStack_38c;
  auVar256 = vsubps_avx(_local_3d8,(undefined1  [16])aVar4);
  auVar148 = vshufps_avx(auVar256,auVar256,0xaa);
  auVar81 = vmovshdup_avx(auVar256);
  auVar256 = vmovsldup_avx(auVar256);
  auVar258._0_4_ = auVar256._0_4_ * fVar193 + auVar81._0_4_ * fVar211 + auVar148._0_4_ * fVar213;
  auVar258._4_4_ = auVar256._4_4_ * fVar216 + auVar81._4_4_ * fVar233 + auVar148._4_4_ * fVar235;
  auVar258._8_4_ = auVar256._8_4_ * fVar210 + auVar81._8_4_ * fVar212 + auVar148._8_4_ * fVar214;
  auVar258._12_4_ = auVar256._12_4_ * fVar232 + auVar81._12_4_ * fVar234 + auVar148._12_4_ * fVar237
  ;
  auVar241._0_4_ = (fVar190 + auVar74._0_4_) * 0.33333334;
  auVar241._4_4_ = (fVar191 + auVar74._4_4_) * 0.33333334;
  auVar241._8_4_ = (fVar192 + auVar74._8_4_) * 0.33333334;
  auVar241._12_4_ = (fVar166 + auVar74._12_4_) * 0.33333334;
  auVar62._4_4_ = fStack_414;
  auVar62._0_4_ = local_418;
  auVar62._8_4_ = fStack_410;
  auVar62._12_4_ = fStack_40c;
  _local_2e8 = vsubps_avx(auVar62,auVar241);
  auVar256 = vsubps_avx(_local_2e8,(undefined1  [16])aVar4);
  auVar148 = vshufps_avx(auVar256,auVar256,0xaa);
  auVar81 = vmovshdup_avx(auVar256);
  auVar256 = vmovsldup_avx(auVar256);
  auVar106._0_4_ = auVar81._0_4_ * fVar211 + auVar148._0_4_ * fVar213 + fVar193 * auVar256._0_4_;
  auVar106._4_4_ = auVar81._4_4_ * fVar233 + auVar148._4_4_ * fVar235 + fVar216 * auVar256._4_4_;
  auVar106._8_4_ = auVar81._8_4_ * fVar212 + auVar148._8_4_ * fVar214 + fVar210 * auVar256._8_4_;
  auVar106._12_4_ = auVar81._12_4_ * fVar234 + auVar148._12_4_ * fVar237 + fVar232 * auVar256._12_4_
  ;
  auVar256 = vsubps_avx(auVar62,(undefined1  [16])aVar4);
  auVar148 = vshufps_avx(auVar256,auVar256,0xaa);
  auVar81 = vmovshdup_avx(auVar256);
  auVar256 = vmovsldup_avx(auVar256);
  auVar76._0_4_ = fVar193 * auVar256._0_4_ + auVar81._0_4_ * fVar211 + auVar148._0_4_ * fVar213;
  auVar76._4_4_ = fVar216 * auVar256._4_4_ + auVar81._4_4_ * fVar233 + auVar148._4_4_ * fVar235;
  auVar76._8_4_ = fVar210 * auVar256._8_4_ + auVar81._8_4_ * fVar212 + auVar148._8_4_ * fVar214;
  auVar76._12_4_ = fVar232 * auVar256._12_4_ + auVar81._12_4_ * fVar234 + auVar148._12_4_ * fVar237;
  _local_3e8 = vmovlhps_avx(_local_498,auVar287);
  _local_338 = vmovlhps_avx(_local_468,auVar258);
  _local_348 = vmovlhps_avx(auVar325,auVar106);
  _local_2c8 = vmovlhps_avx(auVar319,auVar76);
  auVar81 = vminps_avx(_local_3e8,_local_338);
  auVar256 = vminps_avx(_local_348,_local_2c8);
  auVar148 = vminps_avx(auVar81,auVar256);
  auVar81 = vmaxps_avx(_local_3e8,_local_338);
  auVar256 = vmaxps_avx(_local_348,_local_2c8);
  auVar81 = vmaxps_avx(auVar81,auVar256);
  auVar256 = vshufpd_avx(auVar148,auVar148,3);
  auVar148 = vminps_avx(auVar148,auVar256);
  auVar256 = vshufpd_avx(auVar81,auVar81,3);
  auVar256 = vmaxps_avx(auVar81,auVar256);
  auVar222._8_4_ = 0x7fffffff;
  auVar222._0_8_ = 0x7fffffff7fffffff;
  auVar222._12_4_ = 0x7fffffff;
  auVar81 = vandps_avx(auVar148,auVar222);
  auVar256 = vandps_avx(auVar256,auVar222);
  auVar81 = vmaxps_avx(auVar81,auVar256);
  auVar256 = vmovshdup_avx(auVar81);
  auVar81 = vmaxss_avx(auVar256,auVar81);
  fVar193 = auVar81._0_4_ * 9.536743e-07;
  register0x00001388 = auVar287._0_8_;
  local_378 = auVar287._0_8_;
  local_2d8 = ZEXT416((uint)fVar193);
  auVar81 = vshufps_avx(local_2d8,ZEXT416((uint)fVar193),0);
  local_78._16_16_ = auVar81;
  local_78._0_16_ = auVar81;
  auVar77._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
  auVar77._8_4_ = auVar81._8_4_ ^ 0x80000000;
  auVar77._12_4_ = auVar81._12_4_ ^ 0x80000000;
  local_1d8._16_16_ = auVar77;
  local_1d8._0_16_ = auVar77;
  bVar68 = false;
  uVar66 = 0;
  _local_1e8 = vsubps_avx(_local_338,_local_3e8);
  _local_1f8 = vsubps_avx(_local_348,_local_338);
  _local_208 = vsubps_avx(_local_2c8,_local_348);
  auVar155 = ZEXT1664(_local_378);
  _local_228 = vsubps_avx(_local_398,_local_388);
  _local_238 = vsubps_avx(_local_3d8,_local_3b8);
  _local_248 = vsubps_avx(_local_2e8,_local_3c8);
  auVar63._4_4_ = fStack_414;
  auVar63._0_4_ = local_418;
  auVar63._8_4_ = fStack_410;
  auVar63._12_4_ = fStack_40c;
  _local_258 = vsubps_avx(auVar63,_local_3a8);
  auVar231 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar301 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_01033d6c:
  do {
    local_218 = auVar301._0_16_;
    auVar223 = auVar231._0_16_;
    auVar81 = vshufps_avx(auVar223,auVar223,0x50);
    auVar320._8_4_ = 0x3f800000;
    auVar320._0_8_ = 0x3f8000003f800000;
    auVar320._12_4_ = 0x3f800000;
    auVar324._16_4_ = 0x3f800000;
    auVar324._0_16_ = auVar320;
    auVar324._20_4_ = 0x3f800000;
    auVar324._24_4_ = 0x3f800000;
    auVar324._28_4_ = 0x3f800000;
    auVar256 = vsubps_avx(auVar320,auVar81);
    fVar193 = auVar81._0_4_;
    fVar210 = auVar81._4_4_;
    fVar211 = auVar81._8_4_;
    fVar212 = auVar81._12_4_;
    fVar216 = auVar256._0_4_;
    fVar232 = auVar256._4_4_;
    fVar233 = auVar256._8_4_;
    fVar234 = auVar256._12_4_;
    auVar158._0_4_ = auVar155._0_4_ * fVar193 + (float)local_498._0_4_ * fVar216;
    auVar158._4_4_ = auVar155._4_4_ * fVar210 + (float)local_498._4_4_ * fVar232;
    auVar158._8_4_ = auVar155._8_4_ * fVar211 + (float)local_498._0_4_ * fVar233;
    auVar158._12_4_ = auVar155._12_4_ * fVar212 + (float)local_498._4_4_ * fVar234;
    auVar134._0_4_ = auVar258._0_4_ * fVar193 + fVar215 * fVar216;
    auVar134._4_4_ = auVar258._4_4_ * fVar210 + fVar238 * fVar232;
    auVar134._8_4_ = auVar258._0_4_ * fVar211 + fVar215 * fVar233;
    auVar134._12_4_ = auVar258._4_4_ * fVar212 + fVar238 * fVar234;
    auVar242._0_4_ = auVar106._0_4_ * fVar193 + fVar216 * auVar325._0_4_;
    auVar242._4_4_ = auVar106._4_4_ * fVar210 + fVar232 * auVar325._4_4_;
    auVar242._8_4_ = auVar106._0_4_ * fVar211 + fVar233 * auVar325._0_4_;
    auVar242._12_4_ = auVar106._4_4_ * fVar212 + fVar234 * auVar325._4_4_;
    auVar172._0_4_ = auVar76._0_4_ * fVar193 + auVar319._0_4_ * fVar216;
    auVar172._4_4_ = auVar76._4_4_ * fVar210 + auVar319._4_4_ * fVar232;
    auVar172._8_4_ = auVar76._0_4_ * fVar211 + auVar319._0_4_ * fVar233;
    auVar172._12_4_ = auVar76._4_4_ * fVar212 + auVar319._4_4_ * fVar234;
    auVar81 = vmovshdup_avx(local_218);
    auVar256 = vshufps_avx(local_218,local_218,0);
    auVar276._16_16_ = auVar256;
    auVar276._0_16_ = auVar256;
    auVar148 = vshufps_avx(local_218,local_218,0x55);
    auVar96._16_16_ = auVar148;
    auVar96._0_16_ = auVar148;
    auVar92 = vsubps_avx(auVar96,auVar276);
    auVar148 = vshufps_avx(auVar158,auVar158,0);
    auVar120 = vshufps_avx(auVar158,auVar158,0x55);
    auVar109 = vshufps_avx(auVar134,auVar134,0);
    auVar138 = vshufps_avx(auVar134,auVar134,0x55);
    auVar110 = vshufps_avx(auVar242,auVar242,0);
    auVar236 = vshufps_avx(auVar242,auVar242,0x55);
    auVar5 = vshufps_avx(auVar172,auVar172,0);
    auVar6 = vshufps_avx(auVar172,auVar172,0x55);
    auVar81 = ZEXT416((uint)((auVar81._0_4_ - auVar301._0_4_) * 0.04761905));
    auVar81 = vshufps_avx(auVar81,auVar81,0);
    auVar292._0_4_ = auVar256._0_4_ + auVar92._0_4_ * 0.0;
    auVar292._4_4_ = auVar256._4_4_ + auVar92._4_4_ * 0.14285715;
    auVar292._8_4_ = auVar256._8_4_ + auVar92._8_4_ * 0.2857143;
    auVar292._12_4_ = auVar256._12_4_ + auVar92._12_4_ * 0.42857146;
    auVar292._16_4_ = auVar256._0_4_ + auVar92._16_4_ * 0.5714286;
    auVar292._20_4_ = auVar256._4_4_ + auVar92._20_4_ * 0.71428573;
    auVar292._24_4_ = auVar256._8_4_ + auVar92._24_4_ * 0.8571429;
    auVar292._28_4_ = auVar256._12_4_ + auVar92._28_4_;
    auVar15 = vsubps_avx(auVar324,auVar292);
    fVar193 = auVar109._0_4_;
    fVar210 = auVar109._4_4_;
    fVar211 = auVar109._8_4_;
    fVar212 = auVar109._12_4_;
    fVar268 = auVar15._0_4_;
    fVar278 = auVar15._4_4_;
    fVar279 = auVar15._8_4_;
    fVar280 = auVar15._12_4_;
    fVar281 = auVar15._16_4_;
    fVar282 = auVar15._20_4_;
    fVar283 = auVar15._24_4_;
    fVar264 = auVar138._0_4_;
    fVar265 = auVar138._4_4_;
    fVar266 = auVar138._8_4_;
    fVar267 = auVar138._12_4_;
    fVar318 = auVar120._12_4_ + 1.0;
    fVar190 = auVar110._0_4_;
    fVar191 = auVar110._4_4_;
    fVar192 = auVar110._8_4_;
    fVar166 = auVar110._12_4_;
    fVar213 = fVar190 * auVar292._0_4_ + fVar268 * fVar193;
    fVar235 = fVar191 * auVar292._4_4_ + fVar278 * fVar210;
    fVar214 = fVar192 * auVar292._8_4_ + fVar279 * fVar211;
    fVar237 = fVar166 * auVar292._12_4_ + fVar280 * fVar212;
    fVar167 = fVar190 * auVar292._16_4_ + fVar281 * fVar193;
    fVar187 = fVar191 * auVar292._20_4_ + fVar282 * fVar210;
    fVar188 = fVar192 * auVar292._24_4_ + fVar283 * fVar211;
    fVar216 = auVar236._0_4_;
    fVar232 = auVar236._4_4_;
    fVar233 = auVar236._8_4_;
    fVar234 = auVar236._12_4_;
    fVar302 = fVar264 * fVar268 + auVar292._0_4_ * fVar216;
    fVar307 = fVar265 * fVar278 + auVar292._4_4_ * fVar232;
    fVar308 = fVar266 * fVar279 + auVar292._8_4_ * fVar233;
    fVar309 = fVar267 * fVar280 + auVar292._12_4_ * fVar234;
    fVar310 = fVar264 * fVar281 + auVar292._16_4_ * fVar216;
    fVar311 = fVar265 * fVar282 + auVar292._20_4_ * fVar232;
    fVar312 = fVar266 * fVar283 + auVar292._24_4_ * fVar233;
    fVar313 = fVar267 + fVar212;
    auVar256 = vshufps_avx(auVar158,auVar158,0xaa);
    auVar109 = vshufps_avx(auVar158,auVar158,0xff);
    fVar189 = fVar166 + 0.0;
    auVar138 = vshufps_avx(auVar134,auVar134,0xaa);
    auVar110 = vshufps_avx(auVar134,auVar134,0xff);
    auVar185._0_4_ =
         fVar268 * (auVar292._0_4_ * fVar193 + fVar268 * auVar148._0_4_) + auVar292._0_4_ * fVar213;
    auVar185._4_4_ =
         fVar278 * (auVar292._4_4_ * fVar210 + fVar278 * auVar148._4_4_) + auVar292._4_4_ * fVar235;
    auVar185._8_4_ =
         fVar279 * (auVar292._8_4_ * fVar211 + fVar279 * auVar148._8_4_) + auVar292._8_4_ * fVar214;
    auVar185._12_4_ =
         fVar280 * (auVar292._12_4_ * fVar212 + fVar280 * auVar148._12_4_) +
         auVar292._12_4_ * fVar237;
    auVar185._16_4_ =
         fVar281 * (auVar292._16_4_ * fVar193 + fVar281 * auVar148._0_4_) +
         auVar292._16_4_ * fVar167;
    auVar185._20_4_ =
         fVar282 * (auVar292._20_4_ * fVar210 + fVar282 * auVar148._4_4_) +
         auVar292._20_4_ * fVar187;
    auVar185._24_4_ =
         fVar283 * (auVar292._24_4_ * fVar211 + fVar283 * auVar148._8_4_) +
         auVar292._24_4_ * fVar188;
    auVar185._28_4_ = auVar148._12_4_ + 1.0 + fVar234;
    auVar208._0_4_ =
         fVar268 * (fVar264 * auVar292._0_4_ + auVar120._0_4_ * fVar268) + auVar292._0_4_ * fVar302;
    auVar208._4_4_ =
         fVar278 * (fVar265 * auVar292._4_4_ + auVar120._4_4_ * fVar278) + auVar292._4_4_ * fVar307;
    auVar208._8_4_ =
         fVar279 * (fVar266 * auVar292._8_4_ + auVar120._8_4_ * fVar279) + auVar292._8_4_ * fVar308;
    auVar208._12_4_ =
         fVar280 * (fVar267 * auVar292._12_4_ + auVar120._12_4_ * fVar280) +
         auVar292._12_4_ * fVar309;
    auVar208._16_4_ =
         fVar281 * (fVar264 * auVar292._16_4_ + auVar120._0_4_ * fVar281) +
         auVar292._16_4_ * fVar310;
    auVar208._20_4_ =
         fVar282 * (fVar265 * auVar292._20_4_ + auVar120._4_4_ * fVar282) +
         auVar292._20_4_ * fVar311;
    auVar208._24_4_ =
         fVar283 * (fVar266 * auVar292._24_4_ + auVar120._8_4_ * fVar283) +
         auVar292._24_4_ * fVar312;
    auVar208._28_4_ = auVar6._12_4_ + fVar234;
    auVar97._0_4_ =
         fVar268 * fVar213 + auVar292._0_4_ * (fVar190 * fVar268 + auVar5._0_4_ * auVar292._0_4_);
    auVar97._4_4_ =
         fVar278 * fVar235 + auVar292._4_4_ * (fVar191 * fVar278 + auVar5._4_4_ * auVar292._4_4_);
    auVar97._8_4_ =
         fVar279 * fVar214 + auVar292._8_4_ * (fVar192 * fVar279 + auVar5._8_4_ * auVar292._8_4_);
    auVar97._12_4_ =
         fVar280 * fVar237 + auVar292._12_4_ * (fVar166 * fVar280 + auVar5._12_4_ * auVar292._12_4_)
    ;
    auVar97._16_4_ =
         fVar281 * fVar167 + auVar292._16_4_ * (fVar190 * fVar281 + auVar5._0_4_ * auVar292._16_4_);
    auVar97._20_4_ =
         fVar282 * fVar187 + auVar292._20_4_ * (fVar191 * fVar282 + auVar5._4_4_ * auVar292._20_4_);
    auVar97._24_4_ =
         fVar283 * fVar188 + auVar292._24_4_ * (fVar192 * fVar283 + auVar5._8_4_ * auVar292._24_4_);
    auVar97._28_4_ = fVar212 + 1.0 + fVar189;
    auVar300._0_4_ =
         fVar268 * fVar302 + auVar292._0_4_ * (auVar6._0_4_ * auVar292._0_4_ + fVar268 * fVar216);
    auVar300._4_4_ =
         fVar278 * fVar307 + auVar292._4_4_ * (auVar6._4_4_ * auVar292._4_4_ + fVar278 * fVar232);
    auVar300._8_4_ =
         fVar279 * fVar308 + auVar292._8_4_ * (auVar6._8_4_ * auVar292._8_4_ + fVar279 * fVar233);
    auVar300._12_4_ =
         fVar280 * fVar309 + auVar292._12_4_ * (auVar6._12_4_ * auVar292._12_4_ + fVar280 * fVar234)
    ;
    auVar300._16_4_ =
         fVar281 * fVar310 + auVar292._16_4_ * (auVar6._0_4_ * auVar292._16_4_ + fVar281 * fVar216);
    auVar300._20_4_ =
         fVar282 * fVar311 + auVar292._20_4_ * (auVar6._4_4_ * auVar292._20_4_ + fVar282 * fVar232);
    auVar300._24_4_ =
         fVar283 * fVar312 + auVar292._24_4_ * (auVar6._8_4_ * auVar292._24_4_ + fVar283 * fVar233);
    auVar300._28_4_ = fVar189 + fVar234 + 0.0;
    local_b8._0_4_ = fVar268 * auVar185._0_4_ + auVar292._0_4_ * auVar97._0_4_;
    local_b8._4_4_ = fVar278 * auVar185._4_4_ + auVar292._4_4_ * auVar97._4_4_;
    local_b8._8_4_ = fVar279 * auVar185._8_4_ + auVar292._8_4_ * auVar97._8_4_;
    local_b8._12_4_ = fVar280 * auVar185._12_4_ + auVar292._12_4_ * auVar97._12_4_;
    local_b8._16_4_ = fVar281 * auVar185._16_4_ + auVar292._16_4_ * auVar97._16_4_;
    local_b8._20_4_ = fVar282 * auVar185._20_4_ + auVar292._20_4_ * auVar97._20_4_;
    local_b8._24_4_ = fVar283 * auVar185._24_4_ + auVar292._24_4_ * auVar97._24_4_;
    local_b8._28_4_ = fVar313 + fVar234 + 0.0;
    auVar165._0_4_ = fVar268 * auVar208._0_4_ + auVar292._0_4_ * auVar300._0_4_;
    auVar165._4_4_ = fVar278 * auVar208._4_4_ + auVar292._4_4_ * auVar300._4_4_;
    auVar165._8_4_ = fVar279 * auVar208._8_4_ + auVar292._8_4_ * auVar300._8_4_;
    auVar165._12_4_ = fVar280 * auVar208._12_4_ + auVar292._12_4_ * auVar300._12_4_;
    auVar165._16_4_ = fVar281 * auVar208._16_4_ + auVar292._16_4_ * auVar300._16_4_;
    auVar165._20_4_ = fVar282 * auVar208._20_4_ + auVar292._20_4_ * auVar300._20_4_;
    auVar165._24_4_ = fVar283 * auVar208._24_4_ + auVar292._24_4_ * auVar300._24_4_;
    auVar165._28_4_ = fVar313 + fVar189;
    auVar16 = vsubps_avx(auVar97,auVar185);
    auVar92 = vsubps_avx(auVar300,auVar208);
    local_368._0_4_ = auVar81._0_4_;
    local_368._4_4_ = auVar81._4_4_;
    fStack_360 = auVar81._8_4_;
    fStack_35c = auVar81._12_4_;
    local_f8 = (float)local_368._0_4_ * auVar16._0_4_ * 3.0;
    fStack_f4 = (float)local_368._4_4_ * auVar16._4_4_ * 3.0;
    auVar24._4_4_ = fStack_f4;
    auVar24._0_4_ = local_f8;
    fStack_f0 = fStack_360 * auVar16._8_4_ * 3.0;
    auVar24._8_4_ = fStack_f0;
    fStack_ec = fStack_35c * auVar16._12_4_ * 3.0;
    auVar24._12_4_ = fStack_ec;
    fStack_e8 = (float)local_368._0_4_ * auVar16._16_4_ * 3.0;
    auVar24._16_4_ = fStack_e8;
    fStack_e4 = (float)local_368._4_4_ * auVar16._20_4_ * 3.0;
    auVar24._20_4_ = fStack_e4;
    fStack_e0 = fStack_360 * auVar16._24_4_ * 3.0;
    auVar24._24_4_ = fStack_e0;
    auVar24._28_4_ = auVar16._28_4_;
    local_118 = (float)local_368._0_4_ * auVar92._0_4_ * 3.0;
    fStack_114 = (float)local_368._4_4_ * auVar92._4_4_ * 3.0;
    auVar25._4_4_ = fStack_114;
    auVar25._0_4_ = local_118;
    fStack_110 = fStack_360 * auVar92._8_4_ * 3.0;
    auVar25._8_4_ = fStack_110;
    fStack_10c = fStack_35c * auVar92._12_4_ * 3.0;
    auVar25._12_4_ = fStack_10c;
    fStack_108 = (float)local_368._0_4_ * auVar92._16_4_ * 3.0;
    auVar25._16_4_ = fStack_108;
    fStack_104 = (float)local_368._4_4_ * auVar92._20_4_ * 3.0;
    auVar25._20_4_ = fStack_104;
    fStack_100 = fStack_360 * auVar92._24_4_ * 3.0;
    auVar25._24_4_ = fStack_100;
    auVar25._28_4_ = fVar313;
    auVar14 = vsubps_avx(local_b8,auVar24);
    auVar92 = vperm2f128_avx(auVar14,auVar14,1);
    auVar92 = vshufps_avx(auVar92,auVar14,0x30);
    auVar92 = vshufps_avx(auVar14,auVar92,0x29);
    auVar17 = vsubps_avx(auVar165,auVar25);
    auVar14 = vperm2f128_avx(auVar17,auVar17,1);
    auVar14 = vshufps_avx(auVar14,auVar17,0x30);
    _local_468 = vshufps_avx(auVar17,auVar14,0x29);
    fVar311 = auVar138._0_4_;
    fVar312 = auVar138._4_4_;
    fVar326 = auVar138._8_4_;
    fVar212 = auVar256._12_4_;
    fVar191 = auVar110._0_4_;
    fVar166 = auVar110._4_4_;
    fVar302 = auVar110._8_4_;
    fVar307 = auVar110._12_4_;
    auVar81 = vshufps_avx(auVar242,auVar242,0xaa);
    fVar193 = auVar81._0_4_;
    fVar210 = auVar81._4_4_;
    fVar211 = auVar81._8_4_;
    fVar234 = auVar81._12_4_;
    fVar214 = auVar292._0_4_ * fVar193 + fVar311 * fVar268;
    fVar237 = auVar292._4_4_ * fVar210 + fVar312 * fVar278;
    fVar167 = auVar292._8_4_ * fVar211 + fVar326 * fVar279;
    fVar187 = auVar292._12_4_ * fVar234 + auVar138._12_4_ * fVar280;
    fVar188 = auVar292._16_4_ * fVar193 + fVar311 * fVar281;
    fVar189 = auVar292._20_4_ * fVar210 + fVar312 * fVar282;
    fVar190 = auVar292._24_4_ * fVar211 + fVar326 * fVar283;
    auVar81 = vshufps_avx(auVar242,auVar242,0xff);
    fVar216 = auVar81._0_4_;
    fVar232 = auVar81._4_4_;
    fVar233 = auVar81._8_4_;
    fVar213 = auVar81._12_4_;
    fVar192 = auVar292._0_4_ * fVar216 + fVar191 * fVar268;
    fVar264 = auVar292._4_4_ * fVar232 + fVar166 * fVar278;
    fVar265 = auVar292._8_4_ * fVar233 + fVar302 * fVar279;
    fVar266 = auVar292._12_4_ * fVar213 + fVar307 * fVar280;
    fVar308 = auVar292._16_4_ * fVar216 + fVar191 * fVar281;
    fVar267 = auVar292._20_4_ * fVar232 + fVar166 * fVar282;
    fVar309 = auVar292._24_4_ * fVar233 + fVar302 * fVar283;
    auVar81 = vshufps_avx(auVar172,auVar172,0xaa);
    fVar310 = auVar81._12_4_ + fVar234;
    auVar148 = vshufps_avx(auVar172,auVar172,0xff);
    fVar235 = auVar148._12_4_;
    auVar98._0_4_ =
         fVar268 * (fVar311 * auVar292._0_4_ + fVar268 * auVar256._0_4_) + auVar292._0_4_ * fVar214;
    auVar98._4_4_ =
         fVar278 * (fVar312 * auVar292._4_4_ + fVar278 * auVar256._4_4_) + auVar292._4_4_ * fVar237;
    auVar98._8_4_ =
         fVar279 * (fVar326 * auVar292._8_4_ + fVar279 * auVar256._8_4_) + auVar292._8_4_ * fVar167;
    auVar98._12_4_ =
         fVar280 * (auVar138._12_4_ * auVar292._12_4_ + fVar280 * fVar212) +
         auVar292._12_4_ * fVar187;
    auVar98._16_4_ =
         fVar281 * (fVar311 * auVar292._16_4_ + fVar281 * auVar256._0_4_) +
         auVar292._16_4_ * fVar188;
    auVar98._20_4_ =
         fVar282 * (fVar312 * auVar292._20_4_ + fVar282 * auVar256._4_4_) +
         auVar292._20_4_ * fVar189;
    auVar98._24_4_ =
         fVar283 * (fVar326 * auVar292._24_4_ + fVar283 * auVar256._8_4_) +
         auVar292._24_4_ * fVar190;
    auVar98._28_4_ = local_468._28_4_ + fVar212 + fVar235;
    auVar129._0_4_ =
         fVar268 * (fVar191 * auVar292._0_4_ + auVar109._0_4_ * fVar268) + auVar292._0_4_ * fVar192;
    auVar129._4_4_ =
         fVar278 * (fVar166 * auVar292._4_4_ + auVar109._4_4_ * fVar278) + auVar292._4_4_ * fVar264;
    auVar129._8_4_ =
         fVar279 * (fVar302 * auVar292._8_4_ + auVar109._8_4_ * fVar279) + auVar292._8_4_ * fVar265;
    auVar129._12_4_ =
         fVar280 * (fVar307 * auVar292._12_4_ + auVar109._12_4_ * fVar280) +
         auVar292._12_4_ * fVar266;
    auVar129._16_4_ =
         fVar281 * (fVar191 * auVar292._16_4_ + auVar109._0_4_ * fVar281) +
         auVar292._16_4_ * fVar308;
    auVar129._20_4_ =
         fVar282 * (fVar166 * auVar292._20_4_ + auVar109._4_4_ * fVar282) +
         auVar292._20_4_ * fVar267;
    auVar129._24_4_ =
         fVar283 * (fVar302 * auVar292._24_4_ + auVar109._8_4_ * fVar283) +
         auVar292._24_4_ * fVar309;
    auVar129._28_4_ = fVar212 + auVar14._28_4_ + fVar235;
    auVar14 = vperm2f128_avx(local_b8,local_b8,1);
    auVar14 = vshufps_avx(auVar14,local_b8,0x30);
    _local_2b8 = vshufps_avx(local_b8,auVar14,0x29);
    auVar209._0_4_ =
         auVar292._0_4_ * (auVar81._0_4_ * auVar292._0_4_ + fVar268 * fVar193) + fVar268 * fVar214;
    auVar209._4_4_ =
         auVar292._4_4_ * (auVar81._4_4_ * auVar292._4_4_ + fVar278 * fVar210) + fVar278 * fVar237;
    auVar209._8_4_ =
         auVar292._8_4_ * (auVar81._8_4_ * auVar292._8_4_ + fVar279 * fVar211) + fVar279 * fVar167;
    auVar209._12_4_ =
         auVar292._12_4_ * (auVar81._12_4_ * auVar292._12_4_ + fVar280 * fVar234) +
         fVar280 * fVar187;
    auVar209._16_4_ =
         auVar292._16_4_ * (auVar81._0_4_ * auVar292._16_4_ + fVar281 * fVar193) + fVar281 * fVar188
    ;
    auVar209._20_4_ =
         auVar292._20_4_ * (auVar81._4_4_ * auVar292._20_4_ + fVar282 * fVar210) + fVar282 * fVar189
    ;
    auVar209._24_4_ =
         auVar292._24_4_ * (auVar81._8_4_ * auVar292._24_4_ + fVar283 * fVar211) + fVar283 * fVar190
    ;
    auVar209._28_4_ = fVar310 + fVar318 + auVar208._28_4_;
    auVar263._0_4_ =
         fVar268 * fVar192 + auVar292._0_4_ * (auVar292._0_4_ * auVar148._0_4_ + fVar268 * fVar216);
    auVar263._4_4_ =
         fVar278 * fVar264 + auVar292._4_4_ * (auVar292._4_4_ * auVar148._4_4_ + fVar278 * fVar232);
    auVar263._8_4_ =
         fVar279 * fVar265 + auVar292._8_4_ * (auVar292._8_4_ * auVar148._8_4_ + fVar279 * fVar233);
    auVar263._12_4_ =
         fVar280 * fVar266 + auVar292._12_4_ * (auVar292._12_4_ * fVar235 + fVar280 * fVar213);
    auVar263._16_4_ =
         fVar281 * fVar308 +
         auVar292._16_4_ * (auVar292._16_4_ * auVar148._0_4_ + fVar281 * fVar216);
    auVar263._20_4_ =
         fVar282 * fVar267 +
         auVar292._20_4_ * (auVar292._20_4_ * auVar148._4_4_ + fVar282 * fVar232);
    auVar263._24_4_ =
         fVar283 * fVar309 +
         auVar292._24_4_ * (auVar292._24_4_ * auVar148._8_4_ + fVar283 * fVar233);
    auVar263._28_4_ = fVar318 + fVar307 + fVar235 + fVar213;
    auVar251._0_4_ = fVar268 * auVar98._0_4_ + auVar292._0_4_ * auVar209._0_4_;
    auVar251._4_4_ = fVar278 * auVar98._4_4_ + auVar292._4_4_ * auVar209._4_4_;
    auVar251._8_4_ = fVar279 * auVar98._8_4_ + auVar292._8_4_ * auVar209._8_4_;
    auVar251._12_4_ = fVar280 * auVar98._12_4_ + auVar292._12_4_ * auVar209._12_4_;
    auVar251._16_4_ = fVar281 * auVar98._16_4_ + auVar292._16_4_ * auVar209._16_4_;
    auVar251._20_4_ = fVar282 * auVar98._20_4_ + auVar292._20_4_ * auVar209._20_4_;
    auVar251._24_4_ = fVar283 * auVar98._24_4_ + auVar292._24_4_ * auVar209._24_4_;
    auVar251._28_4_ = fVar310 + fVar235 + fVar213;
    auVar277._0_4_ = fVar268 * auVar129._0_4_ + auVar292._0_4_ * auVar263._0_4_;
    auVar277._4_4_ = fVar278 * auVar129._4_4_ + auVar292._4_4_ * auVar263._4_4_;
    auVar277._8_4_ = fVar279 * auVar129._8_4_ + auVar292._8_4_ * auVar263._8_4_;
    auVar277._12_4_ = fVar280 * auVar129._12_4_ + auVar292._12_4_ * auVar263._12_4_;
    auVar277._16_4_ = fVar281 * auVar129._16_4_ + auVar292._16_4_ * auVar263._16_4_;
    auVar277._20_4_ = fVar282 * auVar129._20_4_ + auVar292._20_4_ * auVar263._20_4_;
    auVar277._24_4_ = fVar283 * auVar129._24_4_ + auVar292._24_4_ * auVar263._24_4_;
    auVar277._28_4_ = auVar15._28_4_ + auVar292._28_4_;
    auVar15 = vsubps_avx(auVar209,auVar98);
    auVar14 = vsubps_avx(auVar263,auVar129);
    local_138 = (float)local_368._0_4_ * auVar15._0_4_ * 3.0;
    fStack_134 = (float)local_368._4_4_ * auVar15._4_4_ * 3.0;
    auVar26._4_4_ = fStack_134;
    auVar26._0_4_ = local_138;
    fStack_130 = fStack_360 * auVar15._8_4_ * 3.0;
    auVar26._8_4_ = fStack_130;
    fStack_12c = fStack_35c * auVar15._12_4_ * 3.0;
    auVar26._12_4_ = fStack_12c;
    fStack_128 = (float)local_368._0_4_ * auVar15._16_4_ * 3.0;
    auVar26._16_4_ = fStack_128;
    fStack_124 = (float)local_368._4_4_ * auVar15._20_4_ * 3.0;
    auVar26._20_4_ = fStack_124;
    fStack_120 = fStack_360 * auVar15._24_4_ * 3.0;
    auVar26._24_4_ = fStack_120;
    auVar26._28_4_ = auVar15._28_4_;
    local_158 = (float)local_368._0_4_ * auVar14._0_4_ * 3.0;
    fStack_154 = (float)local_368._4_4_ * auVar14._4_4_ * 3.0;
    auVar27._4_4_ = fStack_154;
    auVar27._0_4_ = local_158;
    fStack_150 = fStack_360 * auVar14._8_4_ * 3.0;
    auVar27._8_4_ = fStack_150;
    fStack_14c = fStack_35c * auVar14._12_4_ * 3.0;
    auVar27._12_4_ = fStack_14c;
    fStack_148 = (float)local_368._0_4_ * auVar14._16_4_ * 3.0;
    auVar27._16_4_ = fStack_148;
    fStack_144 = (float)local_368._4_4_ * auVar14._20_4_ * 3.0;
    auVar27._20_4_ = fStack_144;
    fStack_140 = fStack_360 * auVar14._24_4_ * 3.0;
    auVar27._24_4_ = fStack_140;
    auVar27._28_4_ = auVar209._28_4_;
    auVar14 = vperm2f128_avx(auVar251,auVar251,1);
    auVar14 = vshufps_avx(auVar14,auVar251,0x30);
    auVar18 = vshufps_avx(auVar251,auVar14,0x29);
    auVar17 = vsubps_avx(auVar251,auVar26);
    auVar14 = vperm2f128_avx(auVar17,auVar17,1);
    auVar14 = vshufps_avx(auVar14,auVar17,0x30);
    _local_368 = vshufps_avx(auVar17,auVar14,0x29);
    auVar17 = vsubps_avx(auVar277,auVar27);
    auVar14 = vperm2f128_avx(auVar17,auVar17,1);
    auVar14 = vshufps_avx(auVar14,auVar17,0x30);
    _local_408 = vshufps_avx(auVar17,auVar14,0x29);
    auVar17 = vsubps_avx(auVar251,local_b8);
    auVar19 = vsubps_avx(auVar18,_local_2b8);
    fVar193 = auVar19._0_4_ + auVar17._0_4_;
    fVar216 = auVar19._4_4_ + auVar17._4_4_;
    fVar210 = auVar19._8_4_ + auVar17._8_4_;
    fVar232 = auVar19._12_4_ + auVar17._12_4_;
    fVar211 = auVar19._16_4_ + auVar17._16_4_;
    fVar233 = auVar19._20_4_ + auVar17._20_4_;
    fVar212 = auVar19._24_4_ + auVar17._24_4_;
    auVar14 = vperm2f128_avx(auVar165,auVar165,1);
    auVar14 = vshufps_avx(auVar14,auVar165,0x30);
    local_d8 = vshufps_avx(auVar165,auVar14,0x29);
    auVar14 = vperm2f128_avx(auVar277,auVar277,1);
    auVar14 = vshufps_avx(auVar14,auVar277,0x30);
    local_98 = vshufps_avx(auVar277,auVar14,0x29);
    auVar14 = vsubps_avx(auVar277,auVar165);
    auVar20 = vsubps_avx(local_98,local_d8);
    fVar234 = auVar20._0_4_ + auVar14._0_4_;
    fVar213 = auVar20._4_4_ + auVar14._4_4_;
    fVar235 = auVar20._8_4_ + auVar14._8_4_;
    fVar214 = auVar20._12_4_ + auVar14._12_4_;
    fVar237 = auVar20._16_4_ + auVar14._16_4_;
    fVar167 = auVar20._20_4_ + auVar14._20_4_;
    fVar187 = auVar20._24_4_ + auVar14._24_4_;
    auVar28._4_4_ = fVar216 * auVar165._4_4_;
    auVar28._0_4_ = fVar193 * auVar165._0_4_;
    auVar28._8_4_ = fVar210 * auVar165._8_4_;
    auVar28._12_4_ = fVar232 * auVar165._12_4_;
    auVar28._16_4_ = fVar211 * auVar165._16_4_;
    auVar28._20_4_ = fVar233 * auVar165._20_4_;
    auVar28._24_4_ = fVar212 * auVar165._24_4_;
    auVar28._28_4_ = auVar14._28_4_;
    auVar29._4_4_ = fVar213 * local_b8._4_4_;
    auVar29._0_4_ = fVar234 * local_b8._0_4_;
    auVar29._8_4_ = fVar235 * local_b8._8_4_;
    auVar29._12_4_ = fVar214 * local_b8._12_4_;
    auVar29._16_4_ = fVar237 * local_b8._16_4_;
    auVar29._20_4_ = fVar167 * local_b8._20_4_;
    auVar29._24_4_ = fVar187 * local_b8._24_4_;
    auVar29._28_4_ = fVar310;
    auVar21 = vsubps_avx(auVar28,auVar29);
    local_f8 = local_b8._0_4_ + local_f8;
    fStack_f4 = local_b8._4_4_ + fStack_f4;
    fStack_f0 = local_b8._8_4_ + fStack_f0;
    fStack_ec = local_b8._12_4_ + fStack_ec;
    fStack_e8 = local_b8._16_4_ + fStack_e8;
    fStack_e4 = local_b8._20_4_ + fStack_e4;
    fStack_e0 = local_b8._24_4_ + fStack_e0;
    fStack_dc = local_b8._28_4_ + auVar16._28_4_;
    local_118 = local_118 + auVar165._0_4_;
    fStack_114 = fStack_114 + auVar165._4_4_;
    fStack_110 = fStack_110 + auVar165._8_4_;
    fStack_10c = fStack_10c + auVar165._12_4_;
    fStack_108 = fStack_108 + auVar165._16_4_;
    fStack_104 = fStack_104 + auVar165._20_4_;
    fStack_100 = fStack_100 + auVar165._24_4_;
    fStack_fc = fVar313 + auVar165._28_4_;
    auVar30._4_4_ = fVar216 * fStack_114;
    auVar30._0_4_ = fVar193 * local_118;
    auVar30._8_4_ = fVar210 * fStack_110;
    auVar30._12_4_ = fVar232 * fStack_10c;
    auVar30._16_4_ = fVar211 * fStack_108;
    auVar30._20_4_ = fVar233 * fStack_104;
    auVar30._24_4_ = fVar212 * fStack_100;
    auVar30._28_4_ = fVar313;
    auVar31._4_4_ = fVar213 * fStack_f4;
    auVar31._0_4_ = fVar234 * local_f8;
    auVar31._8_4_ = fVar235 * fStack_f0;
    auVar31._12_4_ = fVar214 * fStack_ec;
    auVar31._16_4_ = fVar237 * fStack_e8;
    auVar31._20_4_ = fVar167 * fStack_e4;
    auVar31._24_4_ = fVar187 * fStack_e0;
    auVar31._28_4_ = fVar313 + auVar165._28_4_;
    auVar16 = vsubps_avx(auVar30,auVar31);
    auVar32._4_4_ = fVar216 * (float)local_468._4_4_;
    auVar32._0_4_ = fVar193 * (float)local_468._0_4_;
    auVar32._8_4_ = fVar210 * fStack_460;
    auVar32._12_4_ = fVar232 * fStack_45c;
    auVar32._16_4_ = fVar211 * fStack_458;
    auVar32._20_4_ = fVar233 * fStack_454;
    auVar32._24_4_ = fVar212 * fStack_450;
    auVar32._28_4_ = fVar313;
    local_448._0_4_ = auVar92._0_4_;
    local_448._4_4_ = auVar92._4_4_;
    fStack_440 = auVar92._8_4_;
    fStack_43c = auVar92._12_4_;
    fStack_438 = auVar92._16_4_;
    fStack_434 = auVar92._20_4_;
    fStack_430 = auVar92._24_4_;
    auVar33._4_4_ = fVar213 * (float)local_448._4_4_;
    auVar33._0_4_ = fVar234 * (float)local_448._0_4_;
    auVar33._8_4_ = fVar235 * fStack_440;
    auVar33._12_4_ = fVar214 * fStack_43c;
    auVar33._16_4_ = fVar237 * fStack_438;
    auVar33._20_4_ = fVar167 * fStack_434;
    auVar33._24_4_ = fVar187 * fStack_430;
    auVar33._28_4_ = local_b8._28_4_;
    auVar22 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = local_d8._4_4_ * fVar216;
    auVar34._0_4_ = local_d8._0_4_ * fVar193;
    auVar34._8_4_ = local_d8._8_4_ * fVar210;
    auVar34._12_4_ = local_d8._12_4_ * fVar232;
    auVar34._16_4_ = local_d8._16_4_ * fVar211;
    auVar34._20_4_ = local_d8._20_4_ * fVar233;
    auVar34._24_4_ = local_d8._24_4_ * fVar212;
    auVar34._28_4_ = fVar313;
    auVar35._4_4_ = local_2b8._4_4_ * fVar213;
    auVar35._0_4_ = local_2b8._0_4_ * fVar234;
    auVar35._8_4_ = local_2b8._8_4_ * fVar235;
    auVar35._12_4_ = local_2b8._12_4_ * fVar214;
    auVar35._16_4_ = local_2b8._16_4_ * fVar237;
    auVar35._20_4_ = local_2b8._20_4_ * fVar167;
    auVar35._24_4_ = local_2b8._24_4_ * fVar187;
    auVar35._28_4_ = local_d8._28_4_;
    auVar23 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = auVar277._4_4_ * fVar216;
    auVar36._0_4_ = auVar277._0_4_ * fVar193;
    auVar36._8_4_ = auVar277._8_4_ * fVar210;
    auVar36._12_4_ = auVar277._12_4_ * fVar232;
    auVar36._16_4_ = auVar277._16_4_ * fVar211;
    auVar36._20_4_ = auVar277._20_4_ * fVar233;
    auVar36._24_4_ = auVar277._24_4_ * fVar212;
    auVar36._28_4_ = fVar313;
    auVar37._4_4_ = fVar213 * auVar251._4_4_;
    auVar37._0_4_ = fVar234 * auVar251._0_4_;
    auVar37._8_4_ = fVar235 * auVar251._8_4_;
    auVar37._12_4_ = fVar214 * auVar251._12_4_;
    auVar37._16_4_ = fVar237 * auVar251._16_4_;
    auVar37._20_4_ = fVar167 * auVar251._20_4_;
    auVar37._24_4_ = fVar187 * auVar251._24_4_;
    auVar37._28_4_ = fStack_dc;
    auVar93 = vsubps_avx(auVar36,auVar37);
    local_138 = auVar251._0_4_ + local_138;
    fStack_134 = auVar251._4_4_ + fStack_134;
    fStack_130 = auVar251._8_4_ + fStack_130;
    fStack_12c = auVar251._12_4_ + fStack_12c;
    fStack_128 = auVar251._16_4_ + fStack_128;
    fStack_124 = auVar251._20_4_ + fStack_124;
    fStack_120 = auVar251._24_4_ + fStack_120;
    fStack_11c = auVar251._28_4_ + auVar15._28_4_;
    local_158 = auVar277._0_4_ + local_158;
    fStack_154 = auVar277._4_4_ + fStack_154;
    fStack_150 = auVar277._8_4_ + fStack_150;
    fStack_14c = auVar277._12_4_ + fStack_14c;
    fStack_148 = auVar277._16_4_ + fStack_148;
    fStack_144 = auVar277._20_4_ + fStack_144;
    fStack_140 = auVar277._24_4_ + fStack_140;
    fStack_13c = auVar277._28_4_ + auVar209._28_4_;
    auVar38._4_4_ = fVar216 * fStack_154;
    auVar38._0_4_ = fVar193 * local_158;
    auVar38._8_4_ = fVar210 * fStack_150;
    auVar38._12_4_ = fVar232 * fStack_14c;
    auVar38._16_4_ = fVar211 * fStack_148;
    auVar38._20_4_ = fVar233 * fStack_144;
    auVar38._24_4_ = fVar212 * fStack_140;
    auVar38._28_4_ = auVar277._28_4_ + auVar209._28_4_;
    auVar39._4_4_ = fStack_134 * fVar213;
    auVar39._0_4_ = local_138 * fVar234;
    auVar39._8_4_ = fStack_130 * fVar235;
    auVar39._12_4_ = fStack_12c * fVar214;
    auVar39._16_4_ = fStack_128 * fVar237;
    auVar39._20_4_ = fStack_124 * fVar167;
    auVar39._24_4_ = fStack_120 * fVar187;
    auVar39._28_4_ = fStack_11c;
    auVar94 = vsubps_avx(auVar38,auVar39);
    auVar40._4_4_ = fVar216 * local_408._4_4_;
    auVar40._0_4_ = fVar193 * local_408._0_4_;
    auVar40._8_4_ = fVar210 * local_408._8_4_;
    auVar40._12_4_ = fVar232 * local_408._12_4_;
    auVar40._16_4_ = fVar211 * local_408._16_4_;
    auVar40._20_4_ = fVar233 * local_408._20_4_;
    auVar40._24_4_ = fVar212 * local_408._24_4_;
    auVar40._28_4_ = fStack_11c;
    auVar41._4_4_ = fVar213 * (float)local_368._4_4_;
    auVar41._0_4_ = fVar234 * (float)local_368._0_4_;
    auVar41._8_4_ = fVar235 * fStack_360;
    auVar41._12_4_ = fVar214 * fStack_35c;
    auVar41._16_4_ = fVar237 * fStack_358;
    auVar41._20_4_ = fVar167 * fStack_354;
    auVar41._24_4_ = fVar187 * fStack_350;
    auVar41._28_4_ = local_408._28_4_;
    auVar125 = vsubps_avx(auVar40,auVar41);
    auVar42._4_4_ = fVar216 * local_98._4_4_;
    auVar42._0_4_ = fVar193 * local_98._0_4_;
    auVar42._8_4_ = fVar210 * local_98._8_4_;
    auVar42._12_4_ = fVar232 * local_98._12_4_;
    auVar42._16_4_ = fVar211 * local_98._16_4_;
    auVar42._20_4_ = fVar233 * local_98._20_4_;
    auVar42._24_4_ = fVar212 * local_98._24_4_;
    auVar42._28_4_ = auVar19._28_4_ + auVar17._28_4_;
    auVar43._4_4_ = auVar18._4_4_ * fVar213;
    auVar43._0_4_ = auVar18._0_4_ * fVar234;
    auVar43._8_4_ = auVar18._8_4_ * fVar235;
    auVar43._12_4_ = auVar18._12_4_ * fVar214;
    auVar43._16_4_ = auVar18._16_4_ * fVar237;
    auVar43._20_4_ = auVar18._20_4_ * fVar167;
    auVar43._24_4_ = auVar18._24_4_ * fVar187;
    auVar43._28_4_ = auVar20._28_4_ + auVar14._28_4_;
    auVar19 = vsubps_avx(auVar42,auVar43);
    auVar14 = vminps_avx(auVar21,auVar16);
    auVar92 = vmaxps_avx(auVar21,auVar16);
    auVar15 = vminps_avx(auVar22,auVar23);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar22,auVar23);
    auVar92 = vmaxps_avx(auVar92,auVar14);
    auVar16 = vminps_avx(auVar93,auVar94);
    auVar14 = vmaxps_avx(auVar93,auVar94);
    auVar17 = vminps_avx(auVar125,auVar19);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar17 = vminps_avx(auVar15,auVar17);
    auVar15 = vmaxps_avx(auVar125,auVar19);
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar92,auVar14);
    auVar92 = vcmpps_avx(auVar17,local_78,2);
    auVar14 = vcmpps_avx(auVar14,local_1d8,5);
    auVar92 = vandps_avx(auVar14,auVar92);
    auVar14 = local_178 & auVar92;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar14 = vsubps_avx(_local_2b8,local_b8);
      auVar15 = vsubps_avx(auVar18,auVar251);
      fVar216 = auVar14._0_4_ + auVar15._0_4_;
      fVar210 = auVar14._4_4_ + auVar15._4_4_;
      fVar232 = auVar14._8_4_ + auVar15._8_4_;
      fVar211 = auVar14._12_4_ + auVar15._12_4_;
      fVar233 = auVar14._16_4_ + auVar15._16_4_;
      fVar212 = auVar14._20_4_ + auVar15._20_4_;
      fVar234 = auVar14._24_4_ + auVar15._24_4_;
      auVar17 = vsubps_avx(local_d8,auVar165);
      auVar19 = vsubps_avx(local_98,auVar277);
      fVar213 = auVar17._0_4_ + auVar19._0_4_;
      fVar235 = auVar17._4_4_ + auVar19._4_4_;
      fVar214 = auVar17._8_4_ + auVar19._8_4_;
      fVar237 = auVar17._12_4_ + auVar19._12_4_;
      fVar167 = auVar17._16_4_ + auVar19._16_4_;
      fVar187 = auVar17._20_4_ + auVar19._20_4_;
      fVar188 = auVar17._24_4_ + auVar19._24_4_;
      fVar193 = auVar19._28_4_;
      auVar44._4_4_ = auVar165._4_4_ * fVar210;
      auVar44._0_4_ = auVar165._0_4_ * fVar216;
      auVar44._8_4_ = auVar165._8_4_ * fVar232;
      auVar44._12_4_ = auVar165._12_4_ * fVar211;
      auVar44._16_4_ = auVar165._16_4_ * fVar233;
      auVar44._20_4_ = auVar165._20_4_ * fVar212;
      auVar44._24_4_ = auVar165._24_4_ * fVar234;
      auVar44._28_4_ = auVar165._28_4_;
      auVar45._4_4_ = local_b8._4_4_ * fVar235;
      auVar45._0_4_ = local_b8._0_4_ * fVar213;
      auVar45._8_4_ = local_b8._8_4_ * fVar214;
      auVar45._12_4_ = local_b8._12_4_ * fVar237;
      auVar45._16_4_ = local_b8._16_4_ * fVar167;
      auVar45._20_4_ = local_b8._20_4_ * fVar187;
      auVar45._24_4_ = local_b8._24_4_ * fVar188;
      auVar45._28_4_ = local_b8._28_4_;
      auVar19 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar210 * fStack_114;
      auVar46._0_4_ = fVar216 * local_118;
      auVar46._8_4_ = fVar232 * fStack_110;
      auVar46._12_4_ = fVar211 * fStack_10c;
      auVar46._16_4_ = fVar233 * fStack_108;
      auVar46._20_4_ = fVar212 * fStack_104;
      auVar46._24_4_ = fVar234 * fStack_100;
      auVar46._28_4_ = auVar165._28_4_;
      auVar47._4_4_ = fVar235 * fStack_f4;
      auVar47._0_4_ = fVar213 * local_f8;
      auVar47._8_4_ = fVar214 * fStack_f0;
      auVar47._12_4_ = fVar237 * fStack_ec;
      auVar47._16_4_ = fVar167 * fStack_e8;
      auVar47._20_4_ = fVar187 * fStack_e4;
      auVar47._24_4_ = fVar188 * fStack_e0;
      auVar47._28_4_ = fVar193;
      auVar20 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar210 * (float)local_468._4_4_;
      auVar48._0_4_ = fVar216 * (float)local_468._0_4_;
      auVar48._8_4_ = fVar232 * fStack_460;
      auVar48._12_4_ = fVar211 * fStack_45c;
      auVar48._16_4_ = fVar233 * fStack_458;
      auVar48._20_4_ = fVar212 * fStack_454;
      auVar48._24_4_ = fVar234 * fStack_450;
      auVar48._28_4_ = fVar193;
      auVar49._4_4_ = fVar235 * (float)local_448._4_4_;
      auVar49._0_4_ = fVar213 * (float)local_448._0_4_;
      auVar49._8_4_ = fVar214 * fStack_440;
      auVar49._12_4_ = fVar237 * fStack_43c;
      auVar49._16_4_ = fVar167 * fStack_438;
      auVar49._20_4_ = fVar187 * fStack_434;
      auVar49._24_4_ = fVar188 * fStack_430;
      auVar49._28_4_ = auVar16._28_4_;
      auVar21 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = local_d8._4_4_ * fVar210;
      auVar50._0_4_ = local_d8._0_4_ * fVar216;
      auVar50._8_4_ = local_d8._8_4_ * fVar232;
      auVar50._12_4_ = local_d8._12_4_ * fVar211;
      auVar50._16_4_ = local_d8._16_4_ * fVar233;
      auVar50._20_4_ = local_d8._20_4_ * fVar212;
      auVar50._24_4_ = local_d8._24_4_ * fVar234;
      auVar50._28_4_ = auVar16._28_4_;
      auVar51._4_4_ = local_2b8._4_4_ * fVar235;
      auVar51._0_4_ = local_2b8._0_4_ * fVar213;
      auVar51._8_4_ = local_2b8._8_4_ * fVar214;
      auVar51._12_4_ = local_2b8._12_4_ * fVar237;
      auVar51._16_4_ = local_2b8._16_4_ * fVar167;
      auVar51._20_4_ = local_2b8._20_4_ * fVar187;
      uVar2 = local_2b8._28_4_;
      auVar51._24_4_ = local_2b8._24_4_ * fVar188;
      auVar51._28_4_ = uVar2;
      auVar22 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = auVar277._4_4_ * fVar210;
      auVar52._0_4_ = auVar277._0_4_ * fVar216;
      auVar52._8_4_ = auVar277._8_4_ * fVar232;
      auVar52._12_4_ = auVar277._12_4_ * fVar211;
      auVar52._16_4_ = auVar277._16_4_ * fVar233;
      auVar52._20_4_ = auVar277._20_4_ * fVar212;
      auVar52._24_4_ = auVar277._24_4_ * fVar234;
      auVar52._28_4_ = uVar2;
      auVar53._4_4_ = auVar251._4_4_ * fVar235;
      auVar53._0_4_ = auVar251._0_4_ * fVar213;
      auVar53._8_4_ = auVar251._8_4_ * fVar214;
      auVar53._12_4_ = auVar251._12_4_ * fVar237;
      auVar53._16_4_ = auVar251._16_4_ * fVar167;
      auVar53._20_4_ = auVar251._20_4_ * fVar187;
      auVar53._24_4_ = auVar251._24_4_ * fVar188;
      auVar53._28_4_ = auVar251._28_4_;
      auVar23 = vsubps_avx(auVar52,auVar53);
      auVar54._4_4_ = fVar210 * fStack_154;
      auVar54._0_4_ = fVar216 * local_158;
      auVar54._8_4_ = fVar232 * fStack_150;
      auVar54._12_4_ = fVar211 * fStack_14c;
      auVar54._16_4_ = fVar233 * fStack_148;
      auVar54._20_4_ = fVar212 * fStack_144;
      auVar54._24_4_ = fVar234 * fStack_140;
      auVar54._28_4_ = uVar2;
      auVar55._4_4_ = fVar235 * fStack_134;
      auVar55._0_4_ = fVar213 * local_138;
      auVar55._8_4_ = fVar214 * fStack_130;
      auVar55._12_4_ = fVar237 * fStack_12c;
      auVar55._16_4_ = fVar167 * fStack_128;
      auVar55._20_4_ = fVar187 * fStack_124;
      auVar55._24_4_ = fVar188 * fStack_120;
      auVar55._28_4_ = auVar277._28_4_;
      auVar93 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = fVar210 * local_408._4_4_;
      auVar56._0_4_ = fVar216 * local_408._0_4_;
      auVar56._8_4_ = fVar232 * local_408._8_4_;
      auVar56._12_4_ = fVar211 * local_408._12_4_;
      auVar56._16_4_ = fVar233 * local_408._16_4_;
      auVar56._20_4_ = fVar212 * local_408._20_4_;
      auVar56._24_4_ = fVar234 * local_408._24_4_;
      auVar56._28_4_ = auVar277._28_4_;
      auVar57._4_4_ = (float)local_368._4_4_ * fVar235;
      auVar57._0_4_ = (float)local_368._0_4_ * fVar213;
      auVar57._8_4_ = fStack_360 * fVar214;
      auVar57._12_4_ = fStack_35c * fVar237;
      auVar57._16_4_ = fStack_358 * fVar167;
      auVar57._20_4_ = fStack_354 * fVar187;
      auVar57._24_4_ = fStack_350 * fVar188;
      auVar57._28_4_ = local_d8._28_4_;
      auVar94 = vsubps_avx(auVar56,auVar57);
      auVar58._4_4_ = local_98._4_4_ * fVar210;
      auVar58._0_4_ = local_98._0_4_ * fVar216;
      auVar58._8_4_ = local_98._8_4_ * fVar232;
      auVar58._12_4_ = local_98._12_4_ * fVar211;
      auVar58._16_4_ = local_98._16_4_ * fVar233;
      auVar58._20_4_ = local_98._20_4_ * fVar212;
      auVar58._24_4_ = local_98._24_4_ * fVar234;
      auVar58._28_4_ = auVar14._28_4_ + auVar15._28_4_;
      auVar59._4_4_ = auVar18._4_4_ * fVar235;
      auVar59._0_4_ = auVar18._0_4_ * fVar213;
      auVar59._8_4_ = auVar18._8_4_ * fVar214;
      auVar59._12_4_ = auVar18._12_4_ * fVar237;
      auVar59._16_4_ = auVar18._16_4_ * fVar167;
      auVar59._20_4_ = auVar18._20_4_ * fVar187;
      auVar59._24_4_ = auVar18._24_4_ * fVar188;
      auVar59._28_4_ = auVar17._28_4_ + fVar193;
      auVar125 = vsubps_avx(auVar58,auVar59);
      auVar15 = vminps_avx(auVar19,auVar20);
      auVar14 = vmaxps_avx(auVar19,auVar20);
      auVar16 = vminps_avx(auVar21,auVar22);
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar21,auVar22);
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar17 = vminps_avx(auVar23,auVar93);
      auVar15 = vmaxps_avx(auVar23,auVar93);
      auVar18 = vminps_avx(auVar94,auVar125);
      auVar17 = vminps_avx(auVar17,auVar18);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar94,auVar125);
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vcmpps_avx(auVar17,local_78,2);
      auVar15 = vcmpps_avx(auVar15,local_1d8,5);
      auVar14 = vandps_avx(auVar15,auVar14);
      auVar92 = vandps_avx(local_178,auVar92);
      auVar15 = auVar92 & auVar14;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar92 = vandps_avx(auVar14,auVar92);
        uVar69 = vmovmskps_avx(auVar92);
        if (uVar69 != 0) {
          uVar67 = (ulong)uVar66;
          auStack_298[uVar67] = uVar69 & 0xff;
          uVar3 = vmovlps_avx(local_218);
          *(undefined8 *)(afStack_1b8 + uVar67 * 2) = uVar3;
          uVar71 = vmovlps_avx(auVar223);
          auStack_58[uVar67] = uVar71;
          uVar66 = uVar66 + 1;
        }
      }
    }
LAB_010343d7:
    do {
      do {
        do {
          do {
            if (uVar66 == 0) {
              if (bVar68) {
                return bVar68;
              }
              fVar193 = ray->tfar;
              auVar101._4_4_ = fVar193;
              auVar101._0_4_ = fVar193;
              auVar101._8_4_ = fVar193;
              auVar101._12_4_ = fVar193;
              auVar101._16_4_ = fVar193;
              auVar101._20_4_ = fVar193;
              auVar101._24_4_ = fVar193;
              auVar101._28_4_ = fVar193;
              auVar92 = vcmpps_avx(local_198,auVar101,2);
              uVar66 = vmovmskps_avx(auVar92);
              uVar66 = (uint)uVar72 & uVar66;
              if (uVar66 == 0) {
                return bVar68;
              }
              goto LAB_01033576;
            }
            uVar67 = (ulong)(uVar66 - 1);
            uVar69 = auStack_298[uVar67];
            fVar193 = afStack_1b8[uVar67 * 2];
            fVar216 = afStack_1b8[uVar67 * 2 + 1];
            auVar224._8_8_ = 0;
            auVar224._0_8_ = auStack_58[uVar67];
            auVar231 = ZEXT1664(auVar224);
            uVar71 = 0;
            if (uVar69 != 0) {
              for (; (uVar69 >> uVar71 & 1) == 0; uVar71 = uVar71 + 1) {
              }
            }
            uVar69 = uVar69 - 1 & uVar69;
            auStack_298[uVar67] = uVar69;
            if (uVar69 == 0) {
              uVar66 = uVar66 - 1;
            }
            fVar232 = (float)(uVar71 + 1) * 0.14285715;
            fVar210 = (1.0 - (float)uVar71 * 0.14285715) * fVar193 +
                      fVar216 * (float)uVar71 * 0.14285715;
            fVar193 = (1.0 - fVar232) * fVar193 + fVar216 * fVar232;
            fVar216 = fVar193 - fVar210;
            if (0.16666667 <= fVar216) {
              auVar81 = vinsertps_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar193),0x10);
              auVar301 = ZEXT1664(auVar81);
              auVar155 = ZEXT1664(_local_378);
              goto LAB_01033d6c;
            }
            auVar81 = vshufps_avx(auVar224,auVar224,0x50);
            auVar107._8_4_ = 0x3f800000;
            auVar107._0_8_ = 0x3f8000003f800000;
            auVar107._12_4_ = 0x3f800000;
            auVar256 = vsubps_avx(auVar107,auVar81);
            fVar234 = auVar81._0_4_;
            fVar213 = auVar81._4_4_;
            fVar235 = auVar81._8_4_;
            fVar214 = auVar81._12_4_;
            fVar232 = auVar256._0_4_;
            fVar211 = auVar256._4_4_;
            fVar233 = auVar256._8_4_;
            fVar212 = auVar256._12_4_;
            auVar135._0_4_ = fVar234 * (float)local_378._0_4_ + (float)local_498._0_4_ * fVar232;
            auVar135._4_4_ = fVar213 * (float)local_378._4_4_ + (float)local_498._4_4_ * fVar211;
            auVar135._8_4_ = fVar235 * fStack_370 + (float)local_498._0_4_ * fVar233;
            auVar135._12_4_ = fVar214 * fStack_36c + (float)local_498._4_4_ * fVar212;
            auVar173._0_4_ = auVar258._0_4_ * fVar234 + fVar215 * fVar232;
            auVar173._4_4_ = auVar258._4_4_ * fVar213 + fVar238 * fVar211;
            auVar173._8_4_ = auVar258._0_4_ * fVar235 + fVar215 * fVar233;
            auVar173._12_4_ = auVar258._4_4_ * fVar214 + fVar238 * fVar212;
            auVar199._0_4_ = auVar106._0_4_ * fVar234 + fVar232 * auVar325._0_4_;
            auVar199._4_4_ = auVar106._4_4_ * fVar213 + fVar211 * auVar325._4_4_;
            auVar199._8_4_ = auVar106._0_4_ * fVar235 + fVar233 * auVar325._0_4_;
            auVar199._12_4_ = auVar106._4_4_ * fVar214 + fVar212 * auVar325._4_4_;
            auVar78._0_4_ = auVar76._0_4_ * fVar234 + auVar319._0_4_ * fVar232;
            auVar78._4_4_ = auVar76._4_4_ * fVar213 + auVar319._4_4_ * fVar211;
            auVar78._8_4_ = auVar76._0_4_ * fVar235 + auVar319._0_4_ * fVar233;
            auVar78._12_4_ = auVar76._4_4_ * fVar214 + auVar319._4_4_ * fVar212;
            auVar130._16_16_ = auVar135;
            auVar130._0_16_ = auVar135;
            auVar153._16_16_ = auVar173;
            auVar153._0_16_ = auVar173;
            auVar186._16_16_ = auVar199;
            auVar186._0_16_ = auVar199;
            _local_448 = ZEXT432((uint)fVar210);
            _local_468 = ZEXT416((uint)fVar193);
            auVar92 = ZEXT2032(CONCAT416(fVar193,ZEXT416((uint)fVar210)));
            auVar92 = vshufps_avx(auVar92,auVar92,0);
            auVar14 = vsubps_avx(auVar153,auVar130);
            fVar232 = auVar92._0_4_;
            fVar211 = auVar92._4_4_;
            fVar233 = auVar92._8_4_;
            fVar212 = auVar92._12_4_;
            fVar234 = auVar92._16_4_;
            fVar213 = auVar92._20_4_;
            fVar235 = auVar92._24_4_;
            auVar131._0_4_ = auVar135._0_4_ + auVar14._0_4_ * fVar232;
            auVar131._4_4_ = auVar135._4_4_ + auVar14._4_4_ * fVar211;
            auVar131._8_4_ = auVar135._8_4_ + auVar14._8_4_ * fVar233;
            auVar131._12_4_ = auVar135._12_4_ + auVar14._12_4_ * fVar212;
            auVar131._16_4_ = auVar135._0_4_ + auVar14._16_4_ * fVar234;
            auVar131._20_4_ = auVar135._4_4_ + auVar14._20_4_ * fVar213;
            auVar131._24_4_ = auVar135._8_4_ + auVar14._24_4_ * fVar235;
            auVar131._28_4_ = auVar135._12_4_ + auVar14._28_4_;
            auVar92 = vsubps_avx(auVar186,auVar153);
            auVar154._0_4_ = auVar173._0_4_ + auVar92._0_4_ * fVar232;
            auVar154._4_4_ = auVar173._4_4_ + auVar92._4_4_ * fVar211;
            auVar154._8_4_ = auVar173._8_4_ + auVar92._8_4_ * fVar233;
            auVar154._12_4_ = auVar173._12_4_ + auVar92._12_4_ * fVar212;
            auVar154._16_4_ = auVar173._0_4_ + auVar92._16_4_ * fVar234;
            auVar154._20_4_ = auVar173._4_4_ + auVar92._20_4_ * fVar213;
            auVar154._24_4_ = auVar173._8_4_ + auVar92._24_4_ * fVar235;
            auVar154._28_4_ = auVar173._12_4_ + auVar92._28_4_;
            auVar81 = vsubps_avx(auVar78,auVar199);
            auVar99._0_4_ = auVar199._0_4_ + auVar81._0_4_ * fVar232;
            auVar99._4_4_ = auVar199._4_4_ + auVar81._4_4_ * fVar211;
            auVar99._8_4_ = auVar199._8_4_ + auVar81._8_4_ * fVar233;
            auVar99._12_4_ = auVar199._12_4_ + auVar81._12_4_ * fVar212;
            auVar99._16_4_ = auVar199._0_4_ + auVar81._0_4_ * fVar234;
            auVar99._20_4_ = auVar199._4_4_ + auVar81._4_4_ * fVar213;
            auVar99._24_4_ = auVar199._8_4_ + auVar81._8_4_ * fVar235;
            auVar99._28_4_ = auVar199._12_4_ + auVar81._12_4_;
            auVar92 = vsubps_avx(auVar154,auVar131);
            auVar132._0_4_ = auVar131._0_4_ + fVar232 * auVar92._0_4_;
            auVar132._4_4_ = auVar131._4_4_ + fVar211 * auVar92._4_4_;
            auVar132._8_4_ = auVar131._8_4_ + fVar233 * auVar92._8_4_;
            auVar132._12_4_ = auVar131._12_4_ + fVar212 * auVar92._12_4_;
            auVar132._16_4_ = auVar131._16_4_ + fVar234 * auVar92._16_4_;
            auVar132._20_4_ = auVar131._20_4_ + fVar213 * auVar92._20_4_;
            auVar132._24_4_ = auVar131._24_4_ + fVar235 * auVar92._24_4_;
            auVar132._28_4_ = auVar131._28_4_ + auVar92._28_4_;
            auVar92 = vsubps_avx(auVar99,auVar154);
            auVar100._0_4_ = auVar154._0_4_ + fVar232 * auVar92._0_4_;
            auVar100._4_4_ = auVar154._4_4_ + fVar211 * auVar92._4_4_;
            auVar100._8_4_ = auVar154._8_4_ + fVar233 * auVar92._8_4_;
            auVar100._12_4_ = auVar154._12_4_ + fVar212 * auVar92._12_4_;
            auVar100._16_4_ = auVar154._16_4_ + fVar234 * auVar92._16_4_;
            auVar100._20_4_ = auVar154._20_4_ + fVar213 * auVar92._20_4_;
            auVar100._24_4_ = auVar154._24_4_ + fVar235 * auVar92._24_4_;
            auVar100._28_4_ = auVar154._28_4_ + auVar92._28_4_;
            auVar92 = vsubps_avx(auVar100,auVar132);
            auVar225._0_4_ = auVar132._0_4_ + fVar232 * auVar92._0_4_;
            auVar225._4_4_ = auVar132._4_4_ + fVar211 * auVar92._4_4_;
            auVar225._8_4_ = auVar132._8_4_ + fVar233 * auVar92._8_4_;
            auVar225._12_4_ = auVar132._12_4_ + fVar212 * auVar92._12_4_;
            auVar230._16_4_ = auVar132._16_4_ + fVar234 * auVar92._16_4_;
            auVar230._0_16_ = auVar225;
            auVar230._20_4_ = auVar132._20_4_ + fVar213 * auVar92._20_4_;
            auVar230._24_4_ = auVar132._24_4_ + fVar235 * auVar92._24_4_;
            auVar230._28_4_ = auVar132._28_4_ + auVar154._28_4_;
            auVar236 = auVar230._16_16_;
            auVar109 = vshufps_avx(ZEXT416((uint)(fVar216 * 0.33333334)),
                                   ZEXT416((uint)(fVar216 * 0.33333334)),0);
            auVar200._0_4_ = auVar225._0_4_ + auVar109._0_4_ * auVar92._0_4_ * 3.0;
            auVar200._4_4_ = auVar225._4_4_ + auVar109._4_4_ * auVar92._4_4_ * 3.0;
            auVar200._8_4_ = auVar225._8_4_ + auVar109._8_4_ * auVar92._8_4_ * 3.0;
            auVar200._12_4_ = auVar225._12_4_ + auVar109._12_4_ * auVar92._12_4_ * 3.0;
            auVar148 = vshufpd_avx(auVar225,auVar225,3);
            auVar120 = vshufpd_avx(auVar236,auVar236,3);
            _local_2b8 = auVar148;
            auVar81 = vsubps_avx(auVar148,auVar225);
            _local_408 = auVar120;
            auVar256 = vsubps_avx(auVar120,auVar236);
            auVar79._0_4_ = auVar81._0_4_ + auVar256._0_4_;
            auVar79._4_4_ = auVar81._4_4_ + auVar256._4_4_;
            auVar79._8_4_ = auVar81._8_4_ + auVar256._8_4_;
            auVar79._12_4_ = auVar81._12_4_ + auVar256._12_4_;
            auVar81 = vmovshdup_avx(auVar225);
            auVar256 = vmovshdup_avx(auVar200);
            auVar138 = vshufps_avx(auVar79,auVar79,0);
            auVar110 = vshufps_avx(auVar79,auVar79,0x55);
            fVar232 = auVar110._0_4_;
            fVar211 = auVar110._4_4_;
            fVar233 = auVar110._8_4_;
            fVar212 = auVar110._12_4_;
            fVar234 = auVar138._0_4_;
            fVar213 = auVar138._4_4_;
            fVar235 = auVar138._8_4_;
            fVar214 = auVar138._12_4_;
            auVar80._0_4_ = fVar234 * auVar225._0_4_ + auVar81._0_4_ * fVar232;
            auVar80._4_4_ = fVar213 * auVar225._4_4_ + auVar81._4_4_ * fVar211;
            auVar80._8_4_ = fVar235 * auVar225._8_4_ + auVar81._8_4_ * fVar233;
            auVar80._12_4_ = fVar214 * auVar225._12_4_ + auVar81._12_4_ * fVar212;
            _local_368 = auVar200;
            auVar136._0_4_ = fVar234 * auVar200._0_4_ + auVar256._0_4_ * fVar232;
            auVar136._4_4_ = fVar213 * auVar200._4_4_ + auVar256._4_4_ * fVar211;
            auVar136._8_4_ = fVar235 * auVar200._8_4_ + auVar256._8_4_ * fVar233;
            auVar136._12_4_ = fVar214 * auVar200._12_4_ + auVar256._12_4_ * fVar212;
            auVar256 = vshufps_avx(auVar80,auVar80,0xe8);
            auVar138 = vshufps_avx(auVar136,auVar136,0xe8);
            auVar81 = vcmpps_avx(auVar256,auVar138,1);
            uVar69 = vextractps_avx(auVar81,0);
            auVar110 = auVar136;
            if ((uVar69 & 1) == 0) {
              auVar110 = auVar80;
            }
            auVar108._0_4_ = auVar109._0_4_ * auVar92._16_4_ * 3.0;
            auVar108._4_4_ = auVar109._4_4_ * auVar92._20_4_ * 3.0;
            auVar108._8_4_ = auVar109._8_4_ * auVar92._24_4_ * 3.0;
            auVar108._12_4_ = auVar109._12_4_ * 0.0;
            auVar6 = vsubps_avx(auVar236,auVar108);
            auVar109 = vmovshdup_avx(auVar6);
            auVar236 = vmovshdup_avx(auVar236);
            fVar237 = auVar6._0_4_;
            fVar167 = auVar6._4_4_;
            auVar174._0_4_ = fVar237 * fVar234 + auVar109._0_4_ * fVar232;
            auVar174._4_4_ = fVar167 * fVar213 + auVar109._4_4_ * fVar211;
            auVar174._8_4_ = auVar6._8_4_ * fVar235 + auVar109._8_4_ * fVar233;
            auVar174._12_4_ = auVar6._12_4_ * fVar214 + auVar109._12_4_ * fVar212;
            auVar201._0_4_ = fVar234 * auVar230._16_4_ + auVar236._0_4_ * fVar232;
            auVar201._4_4_ = fVar213 * auVar230._20_4_ + auVar236._4_4_ * fVar211;
            auVar201._8_4_ = fVar235 * auVar230._24_4_ + auVar236._8_4_ * fVar233;
            auVar201._12_4_ = fVar214 * auVar230._28_4_ + auVar236._12_4_ * fVar212;
            auVar236 = vshufps_avx(auVar174,auVar174,0xe8);
            auVar5 = vshufps_avx(auVar201,auVar201,0xe8);
            auVar109 = vcmpps_avx(auVar236,auVar5,1);
            uVar69 = vextractps_avx(auVar109,0);
            auVar223 = auVar201;
            if ((uVar69 & 1) == 0) {
              auVar223 = auVar174;
            }
            auVar110 = vmaxss_avx(auVar223,auVar110);
            auVar256 = vminps_avx(auVar256,auVar138);
            auVar138 = vminps_avx(auVar236,auVar5);
            auVar138 = vminps_avx(auVar256,auVar138);
            auVar81 = vshufps_avx(auVar81,auVar81,0x55);
            auVar81 = vblendps_avx(auVar81,auVar109,2);
            auVar109 = vpslld_avx(auVar81,0x1f);
            auVar81 = vshufpd_avx(auVar136,auVar136,1);
            auVar81 = vinsertps_avx(auVar81,auVar201,0x9c);
            auVar256 = vshufpd_avx(auVar80,auVar80,1);
            auVar256 = vinsertps_avx(auVar256,auVar174,0x9c);
            auVar81 = vblendvps_avx(auVar256,auVar81,auVar109);
            auVar256 = vmovshdup_avx(auVar81);
            auVar81 = vmaxss_avx(auVar256,auVar81);
            fVar233 = auVar138._0_4_;
            auVar256 = vmovshdup_avx(auVar138);
            fVar211 = auVar81._0_4_;
            fVar212 = auVar256._0_4_;
            fVar232 = auVar110._0_4_;
            if ((fVar233 < 0.0001) && (-0.0001 < fVar211)) break;
            if ((fVar212 < 0.0001 && -0.0001 < fVar232) || (fVar233 < 0.0001 && -0.0001 < fVar232))
            break;
            auVar109 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar81,1);
            auVar256 = vcmpps_avx(auVar256,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar256 = vandps_avx(auVar256,auVar109);
          } while ((auVar256 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar109 = vcmpps_avx(auVar138,_DAT_01f7aa10,1);
          auVar256 = vcmpss_avx(auVar110,ZEXT416(0),1);
          auVar137._8_4_ = 0x3f800000;
          auVar137._0_8_ = 0x3f8000003f800000;
          auVar137._12_4_ = 0x3f800000;
          auVar175._8_4_ = 0xbf800000;
          auVar175._0_8_ = 0xbf800000bf800000;
          auVar175._12_4_ = 0xbf800000;
          auVar256 = vblendvps_avx(auVar137,auVar175,auVar256);
          auVar109 = vblendvps_avx(auVar137,auVar175,auVar109);
          auVar138 = vcmpss_avx(auVar109,auVar256,4);
          auVar138 = vpshufd_avx(ZEXT416(auVar138._0_4_ & 1),0x50);
          auVar138 = vpslld_avx(auVar138,0x1f);
          auVar138 = vpsrad_avx(auVar138,0x1f);
          auVar138 = vpandn_avx(auVar138,_DAT_01fafeb0);
          auVar110 = vmovshdup_avx(auVar109);
          fVar234 = auVar110._0_4_;
          if ((auVar109._0_4_ != fVar234) || (NAN(auVar109._0_4_) || NAN(fVar234))) {
            if ((fVar212 != fVar233) || (NAN(fVar212) || NAN(fVar233))) {
              fVar233 = -fVar233 / (fVar212 - fVar233);
              auVar109 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar233) * 0.0 + fVar233)));
            }
            else {
              auVar109 = ZEXT816(0x3f80000000000000);
              if ((fVar233 != 0.0) || (NAN(fVar233))) {
                auVar109 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar236 = vcmpps_avx(auVar138,auVar109,1);
            auVar110 = vblendps_avx(auVar138,auVar109,2);
            auVar109 = vblendps_avx(auVar109,auVar138,2);
            auVar138 = vblendvps_avx(auVar109,auVar110,auVar236);
          }
          auVar81 = vcmpss_avx(auVar81,ZEXT416(0),1);
          auVar139._8_4_ = 0x3f800000;
          auVar139._0_8_ = 0x3f8000003f800000;
          auVar139._12_4_ = 0x3f800000;
          auVar176._8_4_ = 0xbf800000;
          auVar176._0_8_ = 0xbf800000bf800000;
          auVar176._12_4_ = 0xbf800000;
          auVar81 = vblendvps_avx(auVar139,auVar176,auVar81);
          fVar233 = auVar81._0_4_;
          if ((auVar256._0_4_ != fVar233) || (NAN(auVar256._0_4_) || NAN(fVar233))) {
            if ((fVar211 != fVar232) || (NAN(fVar211) || NAN(fVar232))) {
              fVar232 = -fVar232 / (fVar211 - fVar232);
              auVar81 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar232) * 0.0 + fVar232)));
            }
            else {
              auVar81 = ZEXT816(0x3f80000000000000);
              if ((fVar232 != 0.0) || (NAN(fVar232))) {
                auVar81 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar109 = vcmpps_avx(auVar138,auVar81,1);
            auVar256 = vblendps_avx(auVar138,auVar81,2);
            auVar81 = vblendps_avx(auVar81,auVar138,2);
            auVar138 = vblendvps_avx(auVar81,auVar256,auVar109);
          }
          if ((fVar234 != fVar233) || (NAN(fVar234) || NAN(fVar233))) {
            auVar82._8_4_ = 0x3f800000;
            auVar82._0_8_ = 0x3f8000003f800000;
            auVar82._12_4_ = 0x3f800000;
            auVar81 = vcmpps_avx(auVar138,auVar82,1);
            auVar256 = vinsertps_avx(auVar138,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar140._4_12_ = auVar138._4_12_;
            auVar140._0_4_ = 0x3f800000;
            auVar138 = vblendvps_avx(auVar140,auVar256,auVar81);
          }
          auVar81 = vcmpps_avx(auVar138,_DAT_01f7b6f0,1);
          auVar60._12_4_ = 0;
          auVar60._0_12_ = auVar138._4_12_;
          auVar256 = vinsertps_avx(auVar138,ZEXT416(0x3f800000),0x10);
          auVar81 = vblendvps_avx(auVar256,auVar60 << 0x20,auVar81);
          auVar256 = vmovshdup_avx(auVar81);
        } while (auVar256._0_4_ < auVar81._0_4_);
        auVar83._0_4_ = auVar81._0_4_ + -0.1;
        auVar83._4_4_ = auVar81._4_4_ + 0.1;
        auVar83._8_4_ = auVar81._8_4_ + 0.0;
        auVar83._12_4_ = auVar81._12_4_ + 0.0;
        auVar109 = vshufpd_avx(auVar200,auVar200,3);
        register0x00001388 = 0x3f80000000000000;
        local_368 = 0x3f80000000000000;
        auVar81 = vcmpps_avx(auVar83,_local_368,1);
        auVar61._12_4_ = 0;
        auVar61._0_12_ = auVar83._4_12_;
        auVar256 = vinsertps_avx(auVar83,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar81 = vblendvps_avx(auVar256,auVar61 << 0x20,auVar81);
        auVar256 = vshufpd_avx(auVar6,auVar6,3);
        auVar138 = vshufps_avx(auVar81,auVar81,0x50);
        auVar226._8_4_ = 0x3f800000;
        auVar226._0_8_ = 0x3f8000003f800000;
        auVar226._12_4_ = 0x3f800000;
        auVar110 = vsubps_avx(auVar226,auVar138);
        local_2b8._0_4_ = auVar148._0_4_;
        local_2b8._4_4_ = auVar148._4_4_;
        fStack_2b0 = auVar148._8_4_;
        fStack_2ac = auVar148._12_4_;
        fVar232 = auVar138._0_4_;
        fVar211 = auVar138._4_4_;
        fVar233 = auVar138._8_4_;
        fVar212 = auVar138._12_4_;
        local_408._0_4_ = auVar120._0_4_;
        local_408._4_4_ = auVar120._4_4_;
        fStack_400 = auVar120._8_4_;
        fStack_3fc = auVar120._12_4_;
        fVar234 = auVar110._0_4_;
        fVar213 = auVar110._4_4_;
        fVar235 = auVar110._8_4_;
        fVar214 = auVar110._12_4_;
        auVar84._0_4_ = fVar232 * (float)local_2b8._0_4_ + fVar234 * auVar225._0_4_;
        auVar84._4_4_ = fVar211 * (float)local_2b8._4_4_ + fVar213 * auVar225._4_4_;
        auVar84._8_4_ = fVar233 * fStack_2b0 + fVar235 * auVar225._0_4_;
        auVar84._12_4_ = fVar212 * fStack_2ac + fVar214 * auVar225._4_4_;
        auVar141._0_4_ = fVar232 * auVar109._0_4_ + fVar234 * auVar200._0_4_;
        auVar141._4_4_ = fVar211 * auVar109._4_4_ + fVar213 * auVar200._4_4_;
        auVar141._8_4_ = fVar233 * auVar109._8_4_ + fVar235 * auVar200._0_4_;
        auVar141._12_4_ = fVar212 * auVar109._12_4_ + fVar214 * auVar200._4_4_;
        auVar202._0_4_ = fVar232 * auVar256._0_4_ + fVar234 * fVar237;
        auVar202._4_4_ = fVar211 * auVar256._4_4_ + fVar213 * fVar167;
        auVar202._8_4_ = fVar233 * auVar256._8_4_ + fVar235 * fVar237;
        auVar202._12_4_ = fVar212 * auVar256._12_4_ + fVar214 * fVar167;
        auVar243._0_4_ = fVar232 * (float)local_408._0_4_ + fVar234 * auVar230._16_4_;
        auVar243._4_4_ = fVar211 * (float)local_408._4_4_ + fVar213 * auVar230._20_4_;
        auVar243._8_4_ = fVar233 * fStack_400 + fVar235 * auVar230._16_4_;
        auVar243._12_4_ = fVar212 * fStack_3fc + fVar214 * auVar230._20_4_;
        auVar120 = vsubps_avx(auVar226,auVar81);
        auVar256 = vmovshdup_avx(auVar224);
        auVar148 = vmovsldup_avx(auVar224);
        auVar227._0_4_ = auVar148._0_4_ * auVar120._0_4_ + auVar81._0_4_ * auVar256._0_4_;
        auVar227._4_4_ = auVar148._4_4_ * auVar120._4_4_ + auVar81._4_4_ * auVar256._4_4_;
        auVar227._8_4_ = auVar148._8_4_ * auVar120._8_4_ + auVar81._8_4_ * auVar256._8_4_;
        auVar227._12_4_ = auVar148._12_4_ * auVar120._12_4_ + auVar81._12_4_ * auVar256._12_4_;
        _local_408 = vmovshdup_avx(auVar227);
        auVar81 = vsubps_avx(auVar141,auVar84);
        auVar159._0_4_ = auVar81._0_4_ * 3.0;
        auVar159._4_4_ = auVar81._4_4_ * 3.0;
        auVar159._8_4_ = auVar81._8_4_ * 3.0;
        auVar159._12_4_ = auVar81._12_4_ * 3.0;
        auVar81 = vsubps_avx(auVar202,auVar141);
        auVar259._0_4_ = auVar81._0_4_ * 3.0;
        auVar259._4_4_ = auVar81._4_4_ * 3.0;
        auVar259._8_4_ = auVar81._8_4_ * 3.0;
        auVar259._12_4_ = auVar81._12_4_ * 3.0;
        auVar81 = vsubps_avx(auVar243,auVar202);
        auVar270._0_4_ = auVar81._0_4_ * 3.0;
        auVar270._4_4_ = auVar81._4_4_ * 3.0;
        auVar270._8_4_ = auVar81._8_4_ * 3.0;
        auVar270._12_4_ = auVar81._12_4_ * 3.0;
        auVar256 = vminps_avx(auVar259,auVar270);
        auVar81 = vmaxps_avx(auVar259,auVar270);
        auVar256 = vminps_avx(auVar159,auVar256);
        auVar81 = vmaxps_avx(auVar159,auVar81);
        auVar148 = vshufpd_avx(auVar256,auVar256,3);
        auVar120 = vshufpd_avx(auVar81,auVar81,3);
        auVar256 = vminps_avx(auVar256,auVar148);
        auVar81 = vmaxps_avx(auVar81,auVar120);
        auVar148 = vshufps_avx(ZEXT416((uint)(1.0 / fVar216)),ZEXT416((uint)(1.0 / fVar216)),0);
        auVar260._0_4_ = auVar256._0_4_ * auVar148._0_4_;
        auVar260._4_4_ = auVar256._4_4_ * auVar148._4_4_;
        auVar260._8_4_ = auVar256._8_4_ * auVar148._8_4_;
        auVar260._12_4_ = auVar256._12_4_ * auVar148._12_4_;
        auVar271._0_4_ = auVar148._0_4_ * auVar81._0_4_;
        auVar271._4_4_ = auVar148._4_4_ * auVar81._4_4_;
        auVar271._8_4_ = auVar148._8_4_ * auVar81._8_4_;
        auVar271._12_4_ = auVar148._12_4_ * auVar81._12_4_;
        auVar110 = ZEXT416((uint)(1.0 / (local_408._0_4_ - auVar227._0_4_)));
        auVar81 = vshufpd_avx(auVar84,auVar84,3);
        auVar256 = vshufpd_avx(auVar141,auVar141,3);
        auVar148 = vshufpd_avx(auVar202,auVar202,3);
        auVar120 = vshufpd_avx(auVar243,auVar243,3);
        auVar81 = vsubps_avx(auVar81,auVar84);
        auVar109 = vsubps_avx(auVar256,auVar141);
        auVar138 = vsubps_avx(auVar148,auVar202);
        auVar120 = vsubps_avx(auVar120,auVar243);
        auVar256 = vminps_avx(auVar81,auVar109);
        auVar81 = vmaxps_avx(auVar81,auVar109);
        auVar148 = vminps_avx(auVar138,auVar120);
        auVar148 = vminps_avx(auVar256,auVar148);
        auVar256 = vmaxps_avx(auVar138,auVar120);
        auVar81 = vmaxps_avx(auVar81,auVar256);
        auVar256 = vshufps_avx(auVar110,auVar110,0);
        auVar315._0_4_ = auVar256._0_4_ * auVar148._0_4_;
        auVar315._4_4_ = auVar256._4_4_ * auVar148._4_4_;
        auVar315._8_4_ = auVar256._8_4_ * auVar148._8_4_;
        auVar315._12_4_ = auVar256._12_4_ * auVar148._12_4_;
        auVar321._0_4_ = auVar256._0_4_ * auVar81._0_4_;
        auVar321._4_4_ = auVar256._4_4_ * auVar81._4_4_;
        auVar321._8_4_ = auVar256._8_4_ * auVar81._8_4_;
        auVar321._12_4_ = auVar256._12_4_ * auVar81._12_4_;
        auVar81 = vmovsldup_avx(auVar227);
        auVar288._4_12_ = auVar81._4_12_;
        auVar288._0_4_ = fVar210;
        auVar294._4_12_ = auVar227._4_12_;
        auVar294._0_4_ = fVar193;
        auVar160._0_4_ = (fVar210 + fVar193) * 0.5;
        auVar160._4_4_ = (auVar81._4_4_ + auVar227._4_4_) * 0.5;
        auVar160._8_4_ = (auVar81._8_4_ + auVar227._8_4_) * 0.5;
        auVar160._12_4_ = (auVar81._12_4_ + auVar227._12_4_) * 0.5;
        auVar81 = vshufps_avx(auVar160,auVar160,0);
        fVar232 = auVar81._0_4_;
        fVar211 = auVar81._4_4_;
        fVar233 = auVar81._8_4_;
        fVar212 = auVar81._12_4_;
        auVar111._0_4_ = (float)local_3e8._0_4_ + fVar232 * (float)local_1e8._0_4_;
        auVar111._4_4_ = (float)local_3e8._4_4_ + fVar211 * (float)local_1e8._4_4_;
        auVar111._8_4_ = fStack_3e0 + fVar233 * fStack_1e0;
        auVar111._12_4_ = fStack_3dc + fVar212 * fStack_1dc;
        auVar142._0_4_ = fVar232 * (float)local_1f8._0_4_ + (float)local_338._0_4_;
        auVar142._4_4_ = fVar211 * (float)local_1f8._4_4_ + (float)local_338._4_4_;
        auVar142._8_4_ = fVar233 * fStack_1f0 + fStack_330;
        auVar142._12_4_ = fVar212 * fStack_1ec + fStack_32c;
        auVar203._0_4_ = fVar232 * (float)local_208._0_4_ + (float)local_348._0_4_;
        auVar203._4_4_ = fVar211 * (float)local_208._4_4_ + (float)local_348._4_4_;
        auVar203._8_4_ = fVar233 * fStack_200 + fStack_340;
        auVar203._12_4_ = fVar212 * fStack_1fc + fStack_33c;
        auVar81 = vsubps_avx(auVar142,auVar111);
        auVar112._0_4_ = auVar111._0_4_ + fVar232 * auVar81._0_4_;
        auVar112._4_4_ = auVar111._4_4_ + fVar211 * auVar81._4_4_;
        auVar112._8_4_ = auVar111._8_4_ + fVar233 * auVar81._8_4_;
        auVar112._12_4_ = auVar111._12_4_ + fVar212 * auVar81._12_4_;
        auVar81 = vsubps_avx(auVar203,auVar142);
        auVar143._0_4_ = auVar142._0_4_ + fVar232 * auVar81._0_4_;
        auVar143._4_4_ = auVar142._4_4_ + fVar211 * auVar81._4_4_;
        auVar143._8_4_ = auVar142._8_4_ + fVar233 * auVar81._8_4_;
        auVar143._12_4_ = auVar142._12_4_ + fVar212 * auVar81._12_4_;
        auVar81 = vsubps_avx(auVar143,auVar112);
        fVar232 = auVar112._0_4_ + fVar232 * auVar81._0_4_;
        fVar211 = auVar112._4_4_ + fVar211 * auVar81._4_4_;
        auVar85._0_8_ = CONCAT44(fVar211,fVar232);
        auVar85._8_4_ = auVar112._8_4_ + fVar233 * auVar81._8_4_;
        auVar85._12_4_ = auVar112._12_4_ + fVar212 * auVar81._12_4_;
        fVar233 = auVar81._0_4_ * 3.0;
        fVar212 = auVar81._4_4_ * 3.0;
        auVar113._0_8_ = CONCAT44(fVar212,fVar233);
        auVar113._8_4_ = auVar81._8_4_ * 3.0;
        auVar113._12_4_ = auVar81._12_4_ * 3.0;
        auVar144._8_8_ = auVar85._0_8_;
        auVar144._0_8_ = auVar85._0_8_;
        auVar81 = vshufpd_avx(auVar85,auVar85,3);
        auVar256 = vshufps_avx(auVar160,auVar160,0x55);
        auVar138 = vsubps_avx(auVar81,auVar144);
        auVar305._0_4_ = auVar138._0_4_ * auVar256._0_4_ + fVar232;
        auVar305._4_4_ = auVar138._4_4_ * auVar256._4_4_ + fVar211;
        auVar305._8_4_ = auVar138._8_4_ * auVar256._8_4_ + fVar232;
        auVar305._12_4_ = auVar138._12_4_ * auVar256._12_4_ + fVar211;
        auVar145._8_8_ = auVar113._0_8_;
        auVar145._0_8_ = auVar113._0_8_;
        auVar81 = vshufpd_avx(auVar113,auVar113,1);
        auVar81 = vsubps_avx(auVar81,auVar145);
        auVar114._0_4_ = auVar81._0_4_ * auVar256._0_4_ + fVar233;
        auVar114._4_4_ = auVar81._4_4_ * auVar256._4_4_ + fVar212;
        auVar114._8_4_ = auVar81._8_4_ * auVar256._8_4_ + fVar233;
        auVar114._12_4_ = auVar81._12_4_ * auVar256._12_4_ + fVar212;
        auVar256 = vmovshdup_avx(auVar114);
        auVar204._0_8_ = auVar256._0_8_ ^ 0x8000000080000000;
        auVar204._8_4_ = auVar256._8_4_ ^ 0x80000000;
        auVar204._12_4_ = auVar256._12_4_ ^ 0x80000000;
        auVar148 = vmovshdup_avx(auVar138);
        auVar81 = vunpcklps_avx(auVar148,auVar204);
        auVar120 = vshufps_avx(auVar81,auVar204,4);
        auVar86._0_8_ = auVar138._0_8_ ^ 0x8000000080000000;
        auVar86._8_4_ = -auVar138._8_4_;
        auVar86._12_4_ = -auVar138._12_4_;
        auVar81 = vmovlhps_avx(auVar86,auVar114);
        auVar109 = vshufps_avx(auVar81,auVar114,8);
        auVar81 = ZEXT416((uint)(auVar114._0_4_ * auVar148._0_4_ - auVar138._0_4_ * auVar256._0_4_))
        ;
        auVar256 = vshufps_avx(auVar81,auVar81,0);
        auVar81 = vdivps_avx(auVar120,auVar256);
        auVar256 = vdivps_avx(auVar109,auVar256);
        auVar109 = vinsertps_avx(auVar260,auVar315,0x1c);
        auVar138 = vinsertps_avx(auVar271,auVar321,0x1c);
        auVar110 = vinsertps_avx(auVar315,auVar260,0x4c);
        auVar236 = vinsertps_avx(auVar321,auVar271,0x4c);
        auVar148 = vmovsldup_avx(auVar81);
        auVar272._0_4_ = auVar109._0_4_ * auVar148._0_4_;
        auVar272._4_4_ = auVar109._4_4_ * auVar148._4_4_;
        auVar272._8_4_ = auVar109._8_4_ * auVar148._8_4_;
        auVar272._12_4_ = auVar109._12_4_ * auVar148._12_4_;
        auVar115._0_4_ = auVar148._0_4_ * auVar138._0_4_;
        auVar115._4_4_ = auVar148._4_4_ * auVar138._4_4_;
        auVar115._8_4_ = auVar148._8_4_ * auVar138._8_4_;
        auVar115._12_4_ = auVar148._12_4_ * auVar138._12_4_;
        auVar120 = vminps_avx(auVar272,auVar115);
        auVar148 = vmaxps_avx(auVar115,auVar272);
        auVar5 = vmovsldup_avx(auVar256);
        auVar322._0_4_ = auVar5._0_4_ * auVar110._0_4_;
        auVar322._4_4_ = auVar5._4_4_ * auVar110._4_4_;
        auVar322._8_4_ = auVar5._8_4_ * auVar110._8_4_;
        auVar322._12_4_ = auVar5._12_4_ * auVar110._12_4_;
        auVar273._0_4_ = auVar5._0_4_ * auVar236._0_4_;
        auVar273._4_4_ = auVar5._4_4_ * auVar236._4_4_;
        auVar273._8_4_ = auVar5._8_4_ * auVar236._8_4_;
        auVar273._12_4_ = auVar5._12_4_ * auVar236._12_4_;
        auVar5 = vminps_avx(auVar322,auVar273);
        auVar177._0_4_ = auVar120._0_4_ + auVar5._0_4_;
        auVar177._4_4_ = auVar120._4_4_ + auVar5._4_4_;
        auVar177._8_4_ = auVar120._8_4_ + auVar5._8_4_;
        auVar177._12_4_ = auVar120._12_4_ + auVar5._12_4_;
        auVar120 = vmaxps_avx(auVar273,auVar322);
        auVar5 = vsubps_avx(auVar288,auVar160);
        auVar6 = vsubps_avx(auVar294,auVar160);
        auVar116._0_4_ = auVar120._0_4_ + auVar148._0_4_;
        auVar116._4_4_ = auVar120._4_4_ + auVar148._4_4_;
        auVar116._8_4_ = auVar120._8_4_ + auVar148._8_4_;
        auVar116._12_4_ = auVar120._12_4_ + auVar148._12_4_;
        auVar295._8_8_ = 0x3f800000;
        auVar295._0_8_ = 0x3f800000;
        auVar148 = vsubps_avx(auVar295,auVar116);
        auVar120 = vsubps_avx(auVar295,auVar177);
        fVar235 = auVar5._0_4_;
        auVar296._0_4_ = fVar235 * auVar148._0_4_;
        fVar214 = auVar5._4_4_;
        auVar296._4_4_ = fVar214 * auVar148._4_4_;
        fVar237 = auVar5._8_4_;
        auVar296._8_4_ = fVar237 * auVar148._8_4_;
        fVar167 = auVar5._12_4_;
        auVar296._12_4_ = fVar167 * auVar148._12_4_;
        fVar233 = auVar6._0_4_;
        auVar117._0_4_ = fVar233 * auVar148._0_4_;
        fVar212 = auVar6._4_4_;
        auVar117._4_4_ = fVar212 * auVar148._4_4_;
        fVar234 = auVar6._8_4_;
        auVar117._8_4_ = fVar234 * auVar148._8_4_;
        fVar213 = auVar6._12_4_;
        auVar117._12_4_ = fVar213 * auVar148._12_4_;
        auVar316._0_4_ = fVar235 * auVar120._0_4_;
        auVar316._4_4_ = fVar214 * auVar120._4_4_;
        auVar316._8_4_ = fVar237 * auVar120._8_4_;
        auVar316._12_4_ = fVar167 * auVar120._12_4_;
        auVar178._0_4_ = fVar233 * auVar120._0_4_;
        auVar178._4_4_ = fVar212 * auVar120._4_4_;
        auVar178._8_4_ = fVar234 * auVar120._8_4_;
        auVar178._12_4_ = fVar213 * auVar120._12_4_;
        auVar148 = vminps_avx(auVar296,auVar316);
        auVar120 = vminps_avx(auVar117,auVar178);
        auVar5 = vminps_avx(auVar148,auVar120);
        auVar148 = vmaxps_avx(auVar316,auVar296);
        auVar120 = vmaxps_avx(auVar178,auVar117);
        auVar6 = vshufps_avx(auVar160,auVar160,0x54);
        auVar120 = vmaxps_avx(auVar120,auVar148);
        auVar223 = vshufps_avx(auVar305,auVar305,0);
        auVar7 = vshufps_avx(auVar305,auVar305,0x55);
        auVar148 = vhaddps_avx(auVar5,auVar5);
        auVar120 = vhaddps_avx(auVar120,auVar120);
        auVar179._0_4_ = auVar7._0_4_ * auVar256._0_4_ + auVar223._0_4_ * auVar81._0_4_;
        auVar179._4_4_ = auVar7._4_4_ * auVar256._4_4_ + auVar223._4_4_ * auVar81._4_4_;
        auVar179._8_4_ = auVar7._8_4_ * auVar256._8_4_ + auVar223._8_4_ * auVar81._8_4_;
        auVar179._12_4_ = auVar7._12_4_ * auVar256._12_4_ + auVar223._12_4_ * auVar81._12_4_;
        auVar5 = vsubps_avx(auVar6,auVar179);
        fVar232 = auVar5._0_4_ + auVar148._0_4_;
        fVar211 = auVar5._0_4_ + auVar120._0_4_;
        auVar148 = vmaxss_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar232));
        auVar120 = vminss_avx(ZEXT416((uint)fVar211),ZEXT416((uint)fVar193));
      } while (auVar120._0_4_ < auVar148._0_4_);
      auVar148 = vmovshdup_avx(auVar81);
      auVar180._0_4_ = auVar109._0_4_ * auVar148._0_4_;
      auVar180._4_4_ = auVar109._4_4_ * auVar148._4_4_;
      auVar180._8_4_ = auVar109._8_4_ * auVar148._8_4_;
      auVar180._12_4_ = auVar109._12_4_ * auVar148._12_4_;
      auVar118._0_4_ = auVar148._0_4_ * auVar138._0_4_;
      auVar118._4_4_ = auVar148._4_4_ * auVar138._4_4_;
      auVar118._8_4_ = auVar148._8_4_ * auVar138._8_4_;
      auVar118._12_4_ = auVar148._12_4_ * auVar138._12_4_;
      auVar120 = vminps_avx(auVar180,auVar118);
      auVar148 = vmaxps_avx(auVar118,auVar180);
      auVar109 = vmovshdup_avx(auVar256);
      auVar87._0_4_ = auVar109._0_4_ * auVar110._0_4_;
      auVar87._4_4_ = auVar109._4_4_ * auVar110._4_4_;
      auVar87._8_4_ = auVar109._8_4_ * auVar110._8_4_;
      auVar87._12_4_ = auVar109._12_4_ * auVar110._12_4_;
      auVar181._0_4_ = auVar236._0_4_ * auVar109._0_4_;
      auVar181._4_4_ = auVar236._4_4_ * auVar109._4_4_;
      auVar181._8_4_ = auVar236._8_4_ * auVar109._8_4_;
      auVar181._12_4_ = auVar236._12_4_ * auVar109._12_4_;
      auVar109 = vminps_avx(auVar87,auVar181);
      auVar146._0_4_ = auVar120._0_4_ + auVar109._0_4_;
      auVar146._4_4_ = auVar120._4_4_ + auVar109._4_4_;
      auVar146._8_4_ = auVar120._8_4_ + auVar109._8_4_;
      auVar146._12_4_ = auVar120._12_4_ + auVar109._12_4_;
      auVar120 = vmaxps_avx(auVar181,auVar87);
      auVar88._0_4_ = auVar148._0_4_ + auVar120._0_4_;
      auVar88._4_4_ = auVar148._4_4_ + auVar120._4_4_;
      auVar88._8_4_ = auVar148._8_4_ + auVar120._8_4_;
      auVar88._12_4_ = auVar148._12_4_ + auVar120._12_4_;
      auVar148 = vsubps_avx(_local_368,auVar88);
      auVar120 = vsubps_avx(_local_368,auVar146);
      auVar147._0_4_ = fVar235 * auVar148._0_4_;
      auVar147._4_4_ = fVar214 * auVar148._4_4_;
      auVar147._8_4_ = fVar237 * auVar148._8_4_;
      auVar147._12_4_ = fVar167 * auVar148._12_4_;
      auVar182._0_4_ = fVar235 * auVar120._0_4_;
      auVar182._4_4_ = fVar214 * auVar120._4_4_;
      auVar182._8_4_ = fVar237 * auVar120._8_4_;
      auVar182._12_4_ = fVar167 * auVar120._12_4_;
      auVar89._0_4_ = fVar233 * auVar148._0_4_;
      auVar89._4_4_ = fVar212 * auVar148._4_4_;
      auVar89._8_4_ = fVar234 * auVar148._8_4_;
      auVar89._12_4_ = fVar213 * auVar148._12_4_;
      auVar119._0_4_ = fVar233 * auVar120._0_4_;
      auVar119._4_4_ = fVar212 * auVar120._4_4_;
      auVar119._8_4_ = fVar234 * auVar120._8_4_;
      auVar119._12_4_ = fVar213 * auVar120._12_4_;
      auVar148 = vminps_avx(auVar147,auVar182);
      auVar120 = vminps_avx(auVar89,auVar119);
      auVar148 = vminps_avx(auVar148,auVar120);
      auVar120 = vmaxps_avx(auVar182,auVar147);
      auVar109 = vmaxps_avx(auVar119,auVar89);
      auVar148 = vhaddps_avx(auVar148,auVar148);
      auVar120 = vmaxps_avx(auVar109,auVar120);
      auVar120 = vhaddps_avx(auVar120,auVar120);
      auVar109 = vmovshdup_avx(auVar5);
      auVar231 = ZEXT1664(auVar227);
      auVar138 = ZEXT416((uint)(auVar109._0_4_ + auVar148._0_4_));
      auVar148 = vmaxss_avx(auVar227,auVar138);
      auVar109 = ZEXT416((uint)(auVar109._0_4_ + auVar120._0_4_));
      auVar120 = vminss_avx(auVar109,_local_408);
      auVar261._8_4_ = 0x7fffffff;
      auVar261._0_8_ = 0x7fffffff7fffffff;
      auVar261._12_4_ = 0x7fffffff;
    } while (auVar120._0_4_ < auVar148._0_4_);
    uVar69 = 0;
    if ((fVar210 < fVar232) && (fVar211 < fVar193)) {
      auVar148 = vcmpps_avx(auVar109,_local_408,1);
      auVar120 = vcmpps_avx(auVar227,auVar138,1);
      auVar148 = vandps_avx(auVar120,auVar148);
      uVar69 = auVar148._0_4_;
    }
    if ((3 < uVar66 || fVar216 < 0.001) || (uVar69 & 1) != 0) {
      lVar70 = 200;
      do {
        fVar216 = auVar5._0_4_;
        fVar193 = 1.0 - fVar216;
        auVar148 = ZEXT416((uint)(fVar193 * fVar193 * fVar193));
        auVar148 = vshufps_avx(auVar148,auVar148,0);
        auVar120 = ZEXT416((uint)(fVar216 * 3.0 * fVar193 * fVar193));
        auVar120 = vshufps_avx(auVar120,auVar120,0);
        auVar109 = ZEXT416((uint)(fVar193 * fVar216 * fVar216 * 3.0));
        auVar109 = vshufps_avx(auVar109,auVar109,0);
        auVar138 = ZEXT416((uint)(fVar216 * fVar216 * fVar216));
        auVar138 = vshufps_avx(auVar138,auVar138,0);
        fVar193 = (float)local_3e8._0_4_ * auVar148._0_4_ +
                  (float)local_338._0_4_ * auVar120._0_4_ +
                  (float)local_2c8._0_4_ * auVar138._0_4_ + (float)local_348._0_4_ * auVar109._0_4_;
        fVar216 = (float)local_3e8._4_4_ * auVar148._4_4_ +
                  (float)local_338._4_4_ * auVar120._4_4_ +
                  (float)local_2c8._4_4_ * auVar138._4_4_ + (float)local_348._4_4_ * auVar109._4_4_;
        auVar90._0_8_ = CONCAT44(fVar216,fVar193);
        auVar90._8_4_ =
             fStack_3e0 * auVar148._8_4_ +
             fStack_330 * auVar120._8_4_ + fStack_2c0 * auVar138._8_4_ + fStack_340 * auVar109._8_4_
        ;
        auVar90._12_4_ =
             fStack_3dc * auVar148._12_4_ +
             fStack_32c * auVar120._12_4_ +
             fStack_2bc * auVar138._12_4_ + fStack_33c * auVar109._12_4_;
        auVar121._8_8_ = auVar90._0_8_;
        auVar121._0_8_ = auVar90._0_8_;
        auVar120 = vshufpd_avx(auVar90,auVar90,1);
        auVar148 = vmovshdup_avx(auVar5);
        auVar120 = vsubps_avx(auVar120,auVar121);
        auVar91._0_4_ = auVar148._0_4_ * auVar120._0_4_ + fVar193;
        auVar91._4_4_ = auVar148._4_4_ * auVar120._4_4_ + fVar216;
        auVar91._8_4_ = auVar148._8_4_ * auVar120._8_4_ + fVar193;
        auVar91._12_4_ = auVar148._12_4_ * auVar120._12_4_ + fVar216;
        auVar148 = vshufps_avx(auVar91,auVar91,0);
        auVar120 = vshufps_avx(auVar91,auVar91,0x55);
        auVar122._0_4_ = auVar81._0_4_ * auVar148._0_4_ + auVar256._0_4_ * auVar120._0_4_;
        auVar122._4_4_ = auVar81._4_4_ * auVar148._4_4_ + auVar256._4_4_ * auVar120._4_4_;
        auVar122._8_4_ = auVar81._8_4_ * auVar148._8_4_ + auVar256._8_4_ * auVar120._8_4_;
        auVar122._12_4_ = auVar81._12_4_ * auVar148._12_4_ + auVar256._12_4_ * auVar120._12_4_;
        auVar5 = vsubps_avx(auVar5,auVar122);
        auVar148 = vandps_avx(auVar261,auVar91);
        auVar120 = vshufps_avx(auVar148,auVar148,0xf5);
        auVar148 = vmaxss_avx(auVar120,auVar148);
        if (auVar148._0_4_ < (float)local_2d8._0_4_) {
          fVar193 = auVar5._0_4_;
          if ((0.0 <= fVar193) && (fVar193 <= 1.0)) {
            auVar81 = vmovshdup_avx(auVar5);
            fVar216 = auVar81._0_4_;
            if ((0.0 <= fVar216) && (fVar216 <= 1.0)) {
              auVar81 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                      ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
              auVar236 = vinsertps_avx(auVar81,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),
                                       0x28);
              aVar4 = (ray->org).field_0;
              auVar81 = vsubps_avx(_local_388,(undefined1  [16])aVar4);
              auVar81 = vdpps_avx(auVar81,auVar236,0x7f);
              auVar256 = vsubps_avx(_local_3b8,(undefined1  [16])aVar4);
              auVar256 = vdpps_avx(auVar256,auVar236,0x7f);
              auVar148 = vsubps_avx(_local_3c8,(undefined1  [16])aVar4);
              auVar148 = vdpps_avx(auVar148,auVar236,0x7f);
              auVar120 = vsubps_avx(_local_3a8,(undefined1  [16])aVar4);
              auVar120 = vdpps_avx(auVar120,auVar236,0x7f);
              auVar109 = vsubps_avx(_local_398,(undefined1  [16])aVar4);
              auVar109 = vdpps_avx(auVar109,auVar236,0x7f);
              auVar138 = vsubps_avx(_local_3d8,(undefined1  [16])aVar4);
              auVar138 = vdpps_avx(auVar138,auVar236,0x7f);
              auVar110 = vsubps_avx(_local_2e8,(undefined1  [16])aVar4);
              auVar110 = vdpps_avx(auVar110,auVar236,0x7f);
              auVar64._4_4_ = fStack_414;
              auVar64._0_4_ = local_418;
              auVar64._8_4_ = fStack_410;
              auVar64._12_4_ = fStack_40c;
              auVar6 = vsubps_avx(auVar64,(undefined1  [16])aVar4);
              auVar236 = vdpps_avx(auVar6,auVar236,0x7f);
              fVar212 = 1.0 - fVar216;
              fVar234 = 1.0 - fVar193;
              fVar210 = auVar5._4_4_;
              fVar232 = auVar5._8_4_;
              fVar211 = auVar5._12_4_;
              fVar233 = fVar234 * fVar193 * fVar193 * 3.0;
              auVar205._0_4_ = fVar193 * fVar193 * fVar193;
              auVar205._4_4_ = fVar210 * fVar210 * fVar210;
              auVar205._8_4_ = fVar232 * fVar232 * fVar232;
              auVar205._12_4_ = fVar211 * fVar211 * fVar211;
              fVar210 = fVar193 * 3.0 * fVar234 * fVar234;
              fVar232 = fVar234 * fVar234 * fVar234;
              fVar193 = (fVar212 * auVar81._0_4_ + auVar109._0_4_ * fVar216) * fVar232 +
                        fVar210 * (auVar138._0_4_ * fVar216 + fVar212 * auVar256._0_4_) +
                        fVar233 * (auVar110._0_4_ * fVar216 + fVar212 * auVar148._0_4_) +
                        auVar205._0_4_ * (fVar212 * auVar120._0_4_ + fVar216 * auVar236._0_4_);
              if (((ray->org).field_0.m128[3] <= fVar193) &&
                 (fVar216 = ray->tfar, fVar193 <= fVar216)) {
                pGVar9 = (context->scene->geometries).items[local_420].ptr;
                if ((pGVar9->mask & ray->mask) == 0) {
                  bVar65 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar65 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar81 = vshufps_avx(auVar5,auVar5,0x55);
                  auVar262._8_4_ = 0x3f800000;
                  auVar262._0_8_ = 0x3f8000003f800000;
                  auVar262._12_4_ = 0x3f800000;
                  auVar256 = vsubps_avx(auVar262,auVar81);
                  fVar211 = auVar81._0_4_;
                  fVar212 = auVar81._4_4_;
                  fVar213 = auVar81._8_4_;
                  fVar235 = auVar81._12_4_;
                  fVar214 = auVar256._0_4_;
                  fVar237 = auVar256._4_4_;
                  fVar167 = auVar256._8_4_;
                  fVar187 = auVar256._12_4_;
                  auVar274._0_4_ =
                       fVar211 * (float)local_398._0_4_ + fVar214 * (float)local_388._0_4_;
                  auVar274._4_4_ =
                       fVar212 * (float)local_398._4_4_ + fVar237 * (float)local_388._4_4_;
                  auVar274._8_4_ = fVar213 * fStack_390 + fVar167 * fStack_380;
                  auVar274._12_4_ = fVar235 * fStack_38c + fVar187 * fStack_37c;
                  auVar289._0_4_ =
                       fVar211 * (float)local_3d8._0_4_ + fVar214 * (float)local_3b8._0_4_;
                  auVar289._4_4_ =
                       fVar212 * (float)local_3d8._4_4_ + fVar237 * (float)local_3b8._4_4_;
                  auVar289._8_4_ = fVar213 * fStack_3d0 + fVar167 * fStack_3b0;
                  auVar289._12_4_ = fVar235 * fStack_3cc + fVar187 * fStack_3ac;
                  auVar297._0_4_ =
                       fVar211 * (float)local_2e8._0_4_ + fVar214 * (float)local_3c8._0_4_;
                  auVar297._4_4_ =
                       fVar212 * (float)local_2e8._4_4_ + fVar237 * (float)local_3c8._4_4_;
                  auVar297._8_4_ = fVar213 * fStack_2e0 + fVar167 * fStack_3c0;
                  auVar297._12_4_ = fVar235 * fStack_2dc + fVar187 * fStack_3bc;
                  auVar244._0_4_ = fVar214 * (float)local_3a8._0_4_ + fVar211 * local_418;
                  auVar244._4_4_ = fVar237 * (float)local_3a8._4_4_ + fVar212 * fStack_414;
                  auVar244._8_4_ = fVar167 * fStack_3a0 + fVar213 * fStack_410;
                  auVar244._12_4_ = fVar187 * fStack_39c + fVar235 * fStack_40c;
                  auVar120 = vsubps_avx(auVar289,auVar274);
                  auVar109 = vsubps_avx(auVar297,auVar289);
                  auVar138 = vsubps_avx(auVar244,auVar297);
                  auVar81 = vshufps_avx(auVar5,auVar5,0);
                  fVar235 = auVar81._0_4_;
                  fVar214 = auVar81._4_4_;
                  fVar237 = auVar81._8_4_;
                  fVar167 = auVar81._12_4_;
                  auVar81 = vshufps_avx(ZEXT416((uint)fVar234),ZEXT416((uint)fVar234),0);
                  fVar211 = auVar81._0_4_;
                  fVar212 = auVar81._4_4_;
                  fVar234 = auVar81._8_4_;
                  fVar213 = auVar81._12_4_;
                  auVar81 = vshufps_avx(auVar205,auVar205,0);
                  auVar256 = vshufps_avx(ZEXT416((uint)fVar233),ZEXT416((uint)fVar233),0);
                  auVar148 = vshufps_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),0);
                  auVar183._0_4_ =
                       ((auVar120._0_4_ * fVar211 + fVar235 * auVar109._0_4_) * fVar211 +
                       fVar235 * (auVar109._0_4_ * fVar211 + fVar235 * auVar138._0_4_)) * 3.0;
                  auVar183._4_4_ =
                       ((auVar120._4_4_ * fVar212 + fVar214 * auVar109._4_4_) * fVar212 +
                       fVar214 * (auVar109._4_4_ * fVar212 + fVar214 * auVar138._4_4_)) * 3.0;
                  auVar183._8_4_ =
                       ((auVar120._8_4_ * fVar234 + fVar237 * auVar109._8_4_) * fVar234 +
                       fVar237 * (auVar109._8_4_ * fVar234 + fVar237 * auVar138._8_4_)) * 3.0;
                  auVar183._12_4_ =
                       ((auVar120._12_4_ * fVar213 + fVar167 * auVar109._12_4_) * fVar213 +
                       fVar167 * (auVar109._12_4_ * fVar213 + fVar167 * auVar138._12_4_)) * 3.0;
                  auVar120 = vshufps_avx(ZEXT416((uint)fVar232),ZEXT416((uint)fVar232),0);
                  auVar123._0_4_ =
                       auVar120._0_4_ * (float)local_228._0_4_ +
                       auVar148._0_4_ * (float)local_238._0_4_ +
                       auVar81._0_4_ * (float)local_258._0_4_ +
                       auVar256._0_4_ * (float)local_248._0_4_;
                  auVar123._4_4_ =
                       auVar120._4_4_ * (float)local_228._4_4_ +
                       auVar148._4_4_ * (float)local_238._4_4_ +
                       auVar81._4_4_ * (float)local_258._4_4_ +
                       auVar256._4_4_ * (float)local_248._4_4_;
                  auVar123._8_4_ =
                       auVar120._8_4_ * fStack_220 +
                       auVar148._8_4_ * fStack_230 +
                       auVar81._8_4_ * fStack_250 + auVar256._8_4_ * fStack_240;
                  auVar123._12_4_ =
                       auVar120._12_4_ * fStack_21c +
                       auVar148._12_4_ * fStack_22c +
                       auVar81._12_4_ * fStack_24c + auVar256._12_4_ * fStack_23c;
                  auVar81 = vshufps_avx(auVar183,auVar183,0xc9);
                  auVar149._0_4_ = auVar123._0_4_ * auVar81._0_4_;
                  auVar149._4_4_ = auVar123._4_4_ * auVar81._4_4_;
                  auVar149._8_4_ = auVar123._8_4_ * auVar81._8_4_;
                  auVar149._12_4_ = auVar123._12_4_ * auVar81._12_4_;
                  auVar81 = vshufps_avx(auVar123,auVar123,0xc9);
                  auVar124._0_4_ = auVar183._0_4_ * auVar81._0_4_;
                  auVar124._4_4_ = auVar183._4_4_ * auVar81._4_4_;
                  auVar124._8_4_ = auVar183._8_4_ * auVar81._8_4_;
                  auVar124._12_4_ = auVar183._12_4_ * auVar81._12_4_;
                  auVar256 = vsubps_avx(auVar124,auVar149);
                  auVar81 = vshufps_avx(auVar256,auVar256,0xe9);
                  local_288 = vmovlps_avx(auVar81);
                  local_280 = auVar256._0_4_;
                  local_27c = vmovlps_avx(auVar5);
                  local_274 = (int)local_320;
                  local_270 = (int)local_420;
                  local_26c = context->user->instID[0];
                  local_268 = context->user->instPrimID[0];
                  ray->tfar = fVar193;
                  local_46c = -1;
                  local_318.valid = &local_46c;
                  local_318.geometryUserPtr = pGVar9->userPtr;
                  local_318.context = context->user;
                  local_318.hit = (RTCHitN *)&local_288;
                  local_318.N = 1;
                  local_318.ray = (RTCRayN *)ray;
                  if ((pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar9->occlusionFilterN)(&local_318), *local_318.valid != 0)) {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 == (RTCFilterFunctionN)0x0) ||
                       ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT &&
                         (((pGVar9->field_8).field_0x2 & 0x40) == 0)) ||
                        ((*p_Var10)(&local_318), *local_318.valid != 0)))) {
                      bVar65 = 1;
                      goto LAB_010352fd;
                    }
                  }
                  ray->tfar = fVar216;
                  bVar65 = 0;
                }
LAB_010352fd:
                bVar68 = (bool)(bVar68 | bVar65);
              }
            }
          }
          break;
        }
        lVar70 = lVar70 + -1;
      } while (lVar70 != 0);
      goto LAB_010343d7;
    }
    auVar81 = vinsertps_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar193),0x10);
    auVar301 = ZEXT1664(auVar81);
    auVar155 = ZEXT1664(_local_378);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }